

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<8,16>::
     occluded_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  undefined1 auVar1 [16];
  Primitive PVar2;
  Geometry *pGVar3;
  long lVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [12];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  byte bVar51;
  ulong uVar52;
  byte bVar53;
  byte bVar54;
  ulong uVar55;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  ulong uVar56;
  uint uVar57;
  byte bVar58;
  byte bVar59;
  int iVar60;
  byte bVar61;
  byte bVar62;
  uint uVar63;
  long lVar64;
  undefined1 uVar65;
  bool bVar66;
  undefined1 uVar67;
  bool bVar68;
  ulong uVar69;
  uint uVar137;
  uint uVar138;
  uint uVar139;
  uint uVar140;
  uint uVar141;
  uint uVar142;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar77 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  uint uVar143;
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  float pp;
  float fVar144;
  undefined1 auVar146 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar147 [16];
  float fVar145;
  undefined1 auVar148 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar164;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  float fVar202;
  undefined4 uVar203;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [64];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  float fVar221;
  float fVar228;
  float fVar229;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar230;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar231;
  float fVar232;
  undefined1 auVar233 [32];
  undefined1 auVar234 [64];
  float fVar236;
  undefined1 auVar235 [28];
  undefined1 auVar237 [32];
  float fVar240;
  undefined1 auVar238 [16];
  float fVar241;
  undefined1 auVar239 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [16];
  undefined1 auVar244 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_950;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [16];
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [16];
  undefined1 local_870 [16];
  undefined1 local_860 [16];
  float local_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [16];
  undefined1 local_830 [16];
  undefined1 local_820 [16];
  undefined1 local_810 [16];
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [64];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte local_1a0 [32];
  undefined1 auStack_180 [32];
  float local_160 [2];
  int local_158 [74];
  
  PVar2 = prim[1];
  uVar52 = (ulong)(byte)PVar2;
  fVar221 = *(float *)(prim + uVar52 * 0x19 + 0x12);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar76 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar77 = vsubps_avx(auVar13,*(undefined1 (*) [16])(prim + uVar52 * 0x19 + 6));
  fVar202 = fVar221 * auVar77._0_4_;
  fVar144 = fVar221 * auVar76._0_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar52 * 4 + 6);
  auVar83 = vpmovsxbd_avx2(auVar13);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar52 * 5 + 6);
  auVar82 = vpmovsxbd_avx2(auVar14);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar52 * 6 + 6);
  auVar84 = vpmovsxbd_avx2(auVar70);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar52 * 0xb + 6);
  auVar85 = vpmovsxbd_avx2(auVar72);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6);
  auVar86 = vpmovsxbd_avx2(auVar73);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + (uint)(byte)PVar2 * 0xc + uVar52 + 6);
  auVar87 = vpmovsxbd_avx2(auVar74);
  auVar87 = vcvtdq2ps_avx(auVar87);
  uVar55 = (ulong)(uint)((int)(uVar52 * 9) * 2);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + uVar55 + 6);
  auVar88 = vpmovsxbd_avx2(auVar1);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar55 + uVar52 + 6);
  auVar91 = vpmovsxbd_avx2(auVar71);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar89 = vcvtdq2ps_avx(auVar91);
  uVar69 = (ulong)(uint)((int)(uVar52 * 5) << 2);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar69 + 6);
  auVar80 = vpmovsxbd_avx2(auVar75);
  auVar90 = vcvtdq2ps_avx(auVar80);
  auVar98._4_4_ = fVar144;
  auVar98._0_4_ = fVar144;
  auVar98._8_4_ = fVar144;
  auVar98._12_4_ = fVar144;
  auVar98._16_4_ = fVar144;
  auVar98._20_4_ = fVar144;
  auVar98._24_4_ = fVar144;
  auVar98._28_4_ = fVar144;
  auVar100._8_4_ = 1;
  auVar100._0_8_ = 0x100000001;
  auVar100._12_4_ = 1;
  auVar100._16_4_ = 1;
  auVar100._20_4_ = 1;
  auVar100._24_4_ = 1;
  auVar100._28_4_ = 1;
  auVar92 = ZEXT1632(CONCAT412(fVar221 * auVar76._12_4_,
                               CONCAT48(fVar221 * auVar76._8_4_,
                                        CONCAT44(fVar221 * auVar76._4_4_,fVar144))));
  auVar81 = vpermps_avx2(auVar100,auVar92);
  auVar78 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar79 = vpermps_avx512vl(auVar78,auVar92);
  fVar144 = auVar79._0_4_;
  fVar228 = auVar79._4_4_;
  auVar92._4_4_ = fVar228 * auVar84._4_4_;
  auVar92._0_4_ = fVar144 * auVar84._0_4_;
  fVar229 = auVar79._8_4_;
  auVar92._8_4_ = fVar229 * auVar84._8_4_;
  fVar230 = auVar79._12_4_;
  auVar92._12_4_ = fVar230 * auVar84._12_4_;
  fVar236 = auVar79._16_4_;
  auVar92._16_4_ = fVar236 * auVar84._16_4_;
  fVar145 = auVar79._20_4_;
  auVar92._20_4_ = fVar145 * auVar84._20_4_;
  fVar231 = auVar79._24_4_;
  auVar92._24_4_ = fVar231 * auVar84._24_4_;
  auVar92._28_4_ = auVar91._28_4_;
  auVar91._4_4_ = auVar87._4_4_ * fVar228;
  auVar91._0_4_ = auVar87._0_4_ * fVar144;
  auVar91._8_4_ = auVar87._8_4_ * fVar229;
  auVar91._12_4_ = auVar87._12_4_ * fVar230;
  auVar91._16_4_ = auVar87._16_4_ * fVar236;
  auVar91._20_4_ = auVar87._20_4_ * fVar145;
  auVar91._24_4_ = auVar87._24_4_ * fVar231;
  auVar91._28_4_ = auVar80._28_4_;
  auVar80._4_4_ = auVar90._4_4_ * fVar228;
  auVar80._0_4_ = auVar90._0_4_ * fVar144;
  auVar80._8_4_ = auVar90._8_4_ * fVar229;
  auVar80._12_4_ = auVar90._12_4_ * fVar230;
  auVar80._16_4_ = auVar90._16_4_ * fVar236;
  auVar80._20_4_ = auVar90._20_4_ * fVar145;
  auVar80._24_4_ = auVar90._24_4_ * fVar231;
  auVar80._28_4_ = auVar79._28_4_;
  auVar13 = vfmadd231ps_fma(auVar92,auVar81,auVar82);
  auVar14 = vfmadd231ps_fma(auVar91,auVar81,auVar86);
  auVar70 = vfmadd231ps_fma(auVar80,auVar89,auVar81);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar98,auVar83);
  auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar98,auVar85);
  auVar70 = vfmadd231ps_fma(ZEXT1632(auVar70),auVar88,auVar98);
  auVar99._4_4_ = fVar202;
  auVar99._0_4_ = fVar202;
  auVar99._8_4_ = fVar202;
  auVar99._12_4_ = fVar202;
  auVar99._16_4_ = fVar202;
  auVar99._20_4_ = fVar202;
  auVar99._24_4_ = fVar202;
  auVar99._28_4_ = fVar202;
  auVar80 = ZEXT1632(CONCAT412(fVar221 * auVar77._12_4_,
                               CONCAT48(fVar221 * auVar77._8_4_,
                                        CONCAT44(fVar221 * auVar77._4_4_,fVar202))));
  auVar91 = vpermps_avx2(auVar100,auVar80);
  auVar80 = vpermps_avx512vl(auVar78,auVar80);
  auVar81 = vmulps_avx512vl(auVar80,auVar84);
  auVar94._0_4_ = auVar80._0_4_ * auVar87._0_4_;
  auVar94._4_4_ = auVar80._4_4_ * auVar87._4_4_;
  auVar94._8_4_ = auVar80._8_4_ * auVar87._8_4_;
  auVar94._12_4_ = auVar80._12_4_ * auVar87._12_4_;
  auVar94._16_4_ = auVar80._16_4_ * auVar87._16_4_;
  auVar94._20_4_ = auVar80._20_4_ * auVar87._20_4_;
  auVar94._24_4_ = auVar80._24_4_ * auVar87._24_4_;
  auVar94._28_4_ = 0;
  auVar87._4_4_ = auVar80._4_4_ * auVar90._4_4_;
  auVar87._0_4_ = auVar80._0_4_ * auVar90._0_4_;
  auVar87._8_4_ = auVar80._8_4_ * auVar90._8_4_;
  auVar87._12_4_ = auVar80._12_4_ * auVar90._12_4_;
  auVar87._16_4_ = auVar80._16_4_ * auVar90._16_4_;
  auVar87._20_4_ = auVar80._20_4_ * auVar90._20_4_;
  auVar87._24_4_ = auVar80._24_4_ * auVar90._24_4_;
  auVar87._28_4_ = auVar84._28_4_;
  auVar82 = vfmadd231ps_avx512vl(auVar81,auVar91,auVar82);
  auVar72 = vfmadd231ps_fma(auVar94,auVar91,auVar86);
  auVar73 = vfmadd231ps_fma(auVar87,auVar91,auVar89);
  auVar82 = vfmadd231ps_avx512vl(auVar82,auVar99,auVar83);
  auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar99,auVar85);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar99,auVar88);
  auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar244 = ZEXT3264(auVar83);
  vandps_avx512vl(ZEXT1632(auVar13),auVar83);
  auVar96._8_4_ = 0x219392ef;
  auVar96._0_8_ = 0x219392ef219392ef;
  auVar96._12_4_ = 0x219392ef;
  auVar96._16_4_ = 0x219392ef;
  auVar96._20_4_ = 0x219392ef;
  auVar96._24_4_ = 0x219392ef;
  auVar96._28_4_ = 0x219392ef;
  uVar55 = vcmpps_avx512vl(auVar83,auVar96,1);
  bVar68 = (bool)((byte)uVar55 & 1);
  auVar81._0_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar13._0_4_;
  bVar68 = (bool)((byte)(uVar55 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar13._4_4_;
  bVar68 = (bool)((byte)(uVar55 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar13._8_4_;
  bVar68 = (bool)((byte)(uVar55 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar13._12_4_;
  auVar81._16_4_ = (uint)((byte)(uVar55 >> 4) & 1) * 0x219392ef;
  auVar81._20_4_ = (uint)((byte)(uVar55 >> 5) & 1) * 0x219392ef;
  auVar81._24_4_ = (uint)((byte)(uVar55 >> 6) & 1) * 0x219392ef;
  auVar81._28_4_ = (uint)(byte)(uVar55 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar14),auVar83);
  uVar55 = vcmpps_avx512vl(auVar81,auVar96,1);
  bVar68 = (bool)((byte)uVar55 & 1);
  auVar78._0_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar14._0_4_;
  bVar68 = (bool)((byte)(uVar55 >> 1) & 1);
  auVar78._4_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar14._4_4_;
  bVar68 = (bool)((byte)(uVar55 >> 2) & 1);
  auVar78._8_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar14._8_4_;
  bVar68 = (bool)((byte)(uVar55 >> 3) & 1);
  auVar78._12_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar14._12_4_;
  auVar78._16_4_ = (uint)((byte)(uVar55 >> 4) & 1) * 0x219392ef;
  auVar78._20_4_ = (uint)((byte)(uVar55 >> 5) & 1) * 0x219392ef;
  auVar78._24_4_ = (uint)((byte)(uVar55 >> 6) & 1) * 0x219392ef;
  auVar78._28_4_ = (uint)(byte)(uVar55 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar70),auVar83);
  uVar55 = vcmpps_avx512vl(auVar78,auVar96,1);
  bVar68 = (bool)((byte)uVar55 & 1);
  auVar83._0_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar70._0_4_;
  bVar68 = (bool)((byte)(uVar55 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar70._4_4_;
  bVar68 = (bool)((byte)(uVar55 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar70._8_4_;
  bVar68 = (bool)((byte)(uVar55 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar70._12_4_;
  auVar83._16_4_ = (uint)((byte)(uVar55 >> 4) & 1) * 0x219392ef;
  auVar83._20_4_ = (uint)((byte)(uVar55 >> 5) & 1) * 0x219392ef;
  auVar83._24_4_ = (uint)((byte)(uVar55 >> 6) & 1) * 0x219392ef;
  auVar83._28_4_ = (uint)(byte)(uVar55 >> 7) * 0x219392ef;
  auVar84 = vrcp14ps_avx512vl(auVar81);
  auVar97._8_4_ = 0x3f800000;
  auVar97._0_8_ = &DAT_3f8000003f800000;
  auVar97._12_4_ = 0x3f800000;
  auVar97._16_4_ = 0x3f800000;
  auVar97._20_4_ = 0x3f800000;
  auVar97._24_4_ = 0x3f800000;
  auVar97._28_4_ = 0x3f800000;
  auVar13 = vfnmadd213ps_fma(auVar81,auVar84,auVar97);
  auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar84,auVar84);
  auVar84 = vrcp14ps_avx512vl(auVar78);
  auVar14 = vfnmadd213ps_fma(auVar78,auVar84,auVar97);
  auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar84,auVar84);
  auVar84 = vrcp14ps_avx512vl(auVar83);
  auVar70 = vfnmadd213ps_fma(auVar83,auVar84,auVar97);
  auVar70 = vfmadd132ps_fma(ZEXT1632(auVar70),auVar84,auVar84);
  auVar83 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar52 * 7 + 6));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar84 = vsubps_avx512vl(auVar83,auVar82);
  auVar83 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar52 * 9 + 6));
  auVar88._4_4_ = auVar13._4_4_ * auVar84._4_4_;
  auVar88._0_4_ = auVar13._0_4_ * auVar84._0_4_;
  auVar88._8_4_ = auVar13._8_4_ * auVar84._8_4_;
  auVar88._12_4_ = auVar13._12_4_ * auVar84._12_4_;
  auVar88._16_4_ = auVar84._16_4_ * 0.0;
  auVar88._20_4_ = auVar84._20_4_ * 0.0;
  auVar88._24_4_ = auVar84._24_4_ * 0.0;
  auVar88._28_4_ = auVar84._28_4_;
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx512vl(auVar83,auVar82);
  auVar95._0_4_ = auVar13._0_4_ * auVar83._0_4_;
  auVar95._4_4_ = auVar13._4_4_ * auVar83._4_4_;
  auVar95._8_4_ = auVar13._8_4_ * auVar83._8_4_;
  auVar95._12_4_ = auVar13._12_4_ * auVar83._12_4_;
  auVar95._16_4_ = auVar83._16_4_ * 0.0;
  auVar95._20_4_ = auVar83._20_4_ * 0.0;
  auVar95._24_4_ = auVar83._24_4_ * 0.0;
  auVar95._28_4_ = 0;
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar2 * 0x10 + 6));
  auVar83 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar2 * 0x10 + uVar52 * -2 + 6));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,ZEXT1632(auVar72));
  auVar89._4_4_ = auVar14._4_4_ * auVar83._4_4_;
  auVar89._0_4_ = auVar14._0_4_ * auVar83._0_4_;
  auVar89._8_4_ = auVar14._8_4_ * auVar83._8_4_;
  auVar89._12_4_ = auVar14._12_4_ * auVar83._12_4_;
  auVar89._16_4_ = auVar83._16_4_ * 0.0;
  auVar89._20_4_ = auVar83._20_4_ * 0.0;
  auVar89._24_4_ = auVar83._24_4_ * 0.0;
  auVar89._28_4_ = auVar83._28_4_;
  auVar83 = vcvtdq2ps_avx(auVar82);
  auVar83 = vsubps_avx(auVar83,ZEXT1632(auVar72));
  auVar93._0_4_ = auVar14._0_4_ * auVar83._0_4_;
  auVar93._4_4_ = auVar14._4_4_ * auVar83._4_4_;
  auVar93._8_4_ = auVar14._8_4_ * auVar83._8_4_;
  auVar93._12_4_ = auVar14._12_4_ * auVar83._12_4_;
  auVar93._16_4_ = auVar83._16_4_ * 0.0;
  auVar93._20_4_ = auVar83._20_4_ * 0.0;
  auVar93._24_4_ = auVar83._24_4_ * 0.0;
  auVar93._28_4_ = 0;
  auVar83 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 + uVar52 + 6));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,ZEXT1632(auVar73));
  auVar90._4_4_ = auVar83._4_4_ * auVar70._4_4_;
  auVar90._0_4_ = auVar83._0_4_ * auVar70._0_4_;
  auVar90._8_4_ = auVar83._8_4_ * auVar70._8_4_;
  auVar90._12_4_ = auVar83._12_4_ * auVar70._12_4_;
  auVar90._16_4_ = auVar83._16_4_ * 0.0;
  auVar90._20_4_ = auVar83._20_4_ * 0.0;
  auVar90._24_4_ = auVar83._24_4_ * 0.0;
  auVar90._28_4_ = auVar83._28_4_;
  auVar83 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar52 * 0x17 + 6));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,ZEXT1632(auVar73));
  auVar79._0_4_ = auVar70._0_4_ * auVar83._0_4_;
  auVar79._4_4_ = auVar70._4_4_ * auVar83._4_4_;
  auVar79._8_4_ = auVar70._8_4_ * auVar83._8_4_;
  auVar79._12_4_ = auVar70._12_4_ * auVar83._12_4_;
  auVar79._16_4_ = auVar83._16_4_ * 0.0;
  auVar79._20_4_ = auVar83._20_4_ * 0.0;
  auVar79._24_4_ = auVar83._24_4_ * 0.0;
  auVar79._28_4_ = 0;
  auVar83 = vpminsd_avx2(auVar88,auVar95);
  auVar82 = vpminsd_avx2(auVar89,auVar93);
  auVar83 = vmaxps_avx(auVar83,auVar82);
  auVar82 = vpminsd_avx2(auVar90,auVar79);
  uVar203 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar84._4_4_ = uVar203;
  auVar84._0_4_ = uVar203;
  auVar84._8_4_ = uVar203;
  auVar84._12_4_ = uVar203;
  auVar84._16_4_ = uVar203;
  auVar84._20_4_ = uVar203;
  auVar84._24_4_ = uVar203;
  auVar84._28_4_ = uVar203;
  auVar82 = vmaxps_avx512vl(auVar82,auVar84);
  auVar83 = vmaxps_avx(auVar83,auVar82);
  auVar82._8_4_ = 0x3f7ffffa;
  auVar82._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar82._12_4_ = 0x3f7ffffa;
  auVar82._16_4_ = 0x3f7ffffa;
  auVar82._20_4_ = 0x3f7ffffa;
  auVar82._24_4_ = 0x3f7ffffa;
  auVar82._28_4_ = 0x3f7ffffa;
  local_560 = vmulps_avx512vl(auVar83,auVar82);
  auVar83 = vpmaxsd_avx2(auVar88,auVar95);
  auVar82 = vpmaxsd_avx2(auVar89,auVar93);
  auVar83 = vminps_avx(auVar83,auVar82);
  auVar82 = vpmaxsd_avx2(auVar90,auVar79);
  uVar203 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar85._4_4_ = uVar203;
  auVar85._0_4_ = uVar203;
  auVar85._8_4_ = uVar203;
  auVar85._12_4_ = uVar203;
  auVar85._16_4_ = uVar203;
  auVar85._20_4_ = uVar203;
  auVar85._24_4_ = uVar203;
  auVar85._28_4_ = uVar203;
  auVar82 = vminps_avx512vl(auVar82,auVar85);
  auVar83 = vminps_avx(auVar83,auVar82);
  auVar86._8_4_ = 0x3f800003;
  auVar86._0_8_ = 0x3f8000033f800003;
  auVar86._12_4_ = 0x3f800003;
  auVar86._16_4_ = 0x3f800003;
  auVar86._20_4_ = 0x3f800003;
  auVar86._24_4_ = 0x3f800003;
  auVar86._28_4_ = 0x3f800003;
  auVar83 = vmulps_avx512vl(auVar83,auVar86);
  auVar82 = vpbroadcastd_avx512vl();
  uVar18 = vpcmpgtd_avx512vl(auVar82,_DAT_0205a920);
  uVar16 = vcmpps_avx512vl(local_560,auVar83,2);
  bVar66 = (byte)((byte)uVar16 & (byte)uVar18) == 0;
  bVar68 = !bVar66;
  if (bVar66) {
    return bVar68;
  }
  uVar55 = (ulong)(byte)((byte)uVar16 & (byte)uVar18);
  auVar163 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar163);
LAB_01d811cc:
  lVar64 = 0;
  for (uVar52 = uVar55; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
    lVar64 = lVar64 + 1;
  }
  uVar63 = *(uint *)(prim + 2);
  pGVar3 = (context->scene->geometries).items[uVar63].ptr;
  lVar4 = *(long *)&pGVar3[1].time_range.upper;
  uVar52 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           (ulong)*(uint *)(prim + lVar64 * 4 + 6) *
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar13 = *(undefined1 (*) [16])(lVar4 + (long)pGVar3[1].intersectionFilterN * uVar52);
  auVar14 = *(undefined1 (*) [16])(lVar4 + (long)pGVar3[1].intersectionFilterN * (uVar52 + 1));
  auVar70 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar72 = vinsertps_avx(auVar70,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  uVar203 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar238._4_4_ = uVar203;
  auVar238._0_4_ = uVar203;
  auVar238._8_4_ = uVar203;
  auVar238._12_4_ = uVar203;
  local_700._16_4_ = uVar203;
  local_700._0_16_ = auVar238;
  local_700._20_4_ = uVar203;
  local_700._24_4_ = uVar203;
  local_700._28_4_ = uVar203;
  auVar82 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar70 = vunpcklps_avx512vl(auVar238,auVar82._0_16_);
  fVar221 = *(float *)(ray + k * 4 + 0x180);
  auVar243._4_4_ = fVar221;
  auVar243._0_4_ = fVar221;
  auVar243._8_4_ = fVar221;
  auVar243._12_4_ = fVar221;
  local_720._16_4_ = fVar221;
  local_720._0_16_ = auVar243;
  local_720._20_4_ = fVar221;
  local_720._24_4_ = fVar221;
  local_720._28_4_ = fVar221;
  local_8d0 = vinsertps_avx(auVar70,auVar243,0x28);
  auVar77._8_4_ = 0xbeaaaaab;
  auVar77._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar77._12_4_ = 0xbeaaaaab;
  auVar74 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar3[2].intersectionFilterN +
                              uVar52 * (long)pGVar3[2].pointQueryFunc),auVar13,auVar77);
  auVar73 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar3[2].intersectionFilterN +
                             (long)pGVar3[2].pointQueryFunc * (uVar52 + 1)),auVar14,auVar77);
  auVar217._0_4_ = auVar14._0_4_ + auVar13._0_4_ + auVar74._0_4_ + auVar73._0_4_;
  auVar217._4_4_ = auVar14._4_4_ + auVar13._4_4_ + auVar74._4_4_ + auVar73._4_4_;
  auVar217._8_4_ = auVar14._8_4_ + auVar13._8_4_ + auVar74._8_4_ + auVar73._8_4_;
  auVar217._12_4_ = auVar14._12_4_ + auVar13._12_4_ + auVar74._12_4_ + auVar73._12_4_;
  auVar76._8_4_ = 0x3e800000;
  auVar76._0_8_ = 0x3e8000003e800000;
  auVar76._12_4_ = 0x3e800000;
  auVar70 = vmulps_avx512vl(auVar217,auVar76);
  auVar70 = vsubps_avx(auVar70,auVar72);
  auVar70 = vdpps_avx(auVar70,local_8d0,0x7f);
  fVar144 = *(float *)(ray + k * 4 + 0xc0);
  local_8e0 = vdpps_avx(local_8d0,local_8d0,0x7f);
  auVar163 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar163);
  auVar222._4_12_ = ZEXT812(0) << 0x20;
  auVar222._0_4_ = local_8e0._0_4_;
  auVar71 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar222);
  auVar1 = vfnmadd213ss_fma(auVar71,local_8e0,ZEXT416(0x40000000));
  local_540 = auVar70._0_4_ * auVar71._0_4_ * auVar1._0_4_;
  auVar223._4_4_ = local_540;
  auVar223._0_4_ = local_540;
  auVar223._8_4_ = local_540;
  auVar223._12_4_ = local_540;
  fStack_6d0 = local_540;
  _local_6e0 = auVar223;
  fStack_6cc = local_540;
  fStack_6c8 = local_540;
  fStack_6c4 = local_540;
  auVar70 = vfmadd231ps_fma(auVar72,local_8d0,auVar223);
  auVar70 = vblendps_avx(auVar70,ZEXT816(0) << 0x40,8);
  auVar13 = vsubps_avx(auVar13,auVar70);
  auVar72 = vsubps_avx(auVar73,auVar70);
  auVar73 = vsubps_avx(auVar74,auVar70);
  auVar14 = vsubps_avx(auVar14,auVar70);
  uVar203 = auVar13._0_4_;
  local_8c0._4_4_ = uVar203;
  local_8c0._0_4_ = uVar203;
  local_8c0._8_4_ = uVar203;
  local_8c0._12_4_ = uVar203;
  local_8c0._16_4_ = uVar203;
  local_8c0._20_4_ = uVar203;
  local_8c0._24_4_ = uVar203;
  local_8c0._28_4_ = uVar203;
  auVar234 = ZEXT3264(local_8c0);
  auVar101._8_4_ = 1;
  auVar101._0_8_ = 0x100000001;
  auVar101._12_4_ = 1;
  auVar101._16_4_ = 1;
  auVar101._20_4_ = 1;
  auVar101._24_4_ = 1;
  auVar101._28_4_ = 1;
  local_780 = ZEXT1632(auVar13);
  auVar83 = vpermps_avx2(auVar101,local_780);
  auVar102._8_4_ = 2;
  auVar102._0_8_ = 0x200000002;
  auVar102._12_4_ = 2;
  auVar102._16_4_ = 2;
  auVar102._20_4_ = 2;
  auVar102._24_4_ = 2;
  auVar102._28_4_ = 2;
  auVar84 = vpermps_avx512vl(auVar102,local_780);
  auVar103._8_4_ = 3;
  auVar103._0_8_ = 0x300000003;
  auVar103._12_4_ = 3;
  auVar103._16_4_ = 3;
  auVar103._20_4_ = 3;
  auVar103._24_4_ = 3;
  auVar103._28_4_ = 3;
  auVar85 = vpermps_avx512vl(auVar103,local_780);
  uVar203 = auVar73._0_4_;
  local_800._4_4_ = uVar203;
  local_800._0_4_ = uVar203;
  local_800._8_4_ = uVar203;
  local_800._12_4_ = uVar203;
  local_800._16_4_ = uVar203;
  local_800._20_4_ = uVar203;
  local_800._24_4_ = uVar203;
  local_800._28_4_ = uVar203;
  local_7c0 = ZEXT1632(auVar73);
  local_920 = vpermps_avx2(auVar101,local_7c0);
  auVar86 = vpermps_avx512vl(auVar102,local_7c0);
  auVar87 = vpermps_avx512vl(auVar103,local_7c0);
  auVar88 = vbroadcastss_avx512vl(auVar72);
  local_7a0 = ZEXT1632(auVar72);
  auVar89 = vpermps_avx512vl(auVar101,local_7a0);
  auVar90 = vpermps_avx512vl(auVar102,local_7a0);
  auVar91 = vpermps_avx512vl(auVar103,local_7a0);
  auVar216 = ZEXT3264(local_920);
  auVar80 = vbroadcastss_avx512vl(auVar14);
  _local_7e0 = ZEXT1632(auVar14);
  auVar81 = vpermps_avx512vl(auVar101,_local_7e0);
  auVar92 = vpermps_avx512vl(auVar102,_local_7e0);
  auVar78 = vpermps_avx512vl(auVar103,_local_7e0);
  auVar163 = ZEXT3264(local_800);
  local_5e0 = vfmadd231ps_avx512vl(ZEXT432((uint)(fVar221 * fVar221)),auVar82,auVar82);
  auVar13 = vfmadd231ps_fma(local_5e0,local_700,local_700);
  local_520._0_4_ = auVar13._0_4_;
  local_520._4_4_ = local_520._0_4_;
  local_520._8_4_ = local_520._0_4_;
  local_520._12_4_ = local_520._0_4_;
  local_520._16_4_ = local_520._0_4_;
  local_520._20_4_ = local_520._0_4_;
  local_520._24_4_ = local_520._0_4_;
  local_520._28_4_ = local_520._0_4_;
  vandps_avx512vl(local_520,auVar244._0_32_);
  local_860 = ZEXT416((uint)local_540);
  local_540 = fVar144 - local_540;
  fStack_53c = local_540;
  fStack_538 = local_540;
  fStack_534 = local_540;
  fStack_530 = local_540;
  fStack_52c = local_540;
  fStack_528 = local_540;
  fStack_524 = local_540;
  uVar52 = 0;
  bVar61 = 0;
  iVar60 = 1;
  auVar244 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar244);
  auVar13 = vsqrtss_avx(local_8e0,local_8e0);
  auVar14 = vsqrtss_avx(local_8e0,local_8e0);
  local_880 = ZEXT816(0x3f80000000000000);
  auVar209 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  do {
    auVar70 = vmovshdup_avx(local_880);
    auVar220._0_4_ = local_880._0_4_;
    fVar145 = auVar70._0_4_ - auVar220._0_4_;
    fVar236 = fVar145 * 0.04761905;
    auVar220._4_4_ = auVar220._0_4_;
    auVar220._8_4_ = auVar220._0_4_;
    auVar220._12_4_ = auVar220._0_4_;
    auVar220._16_4_ = auVar220._0_4_;
    auVar220._20_4_ = auVar220._0_4_;
    auVar220._24_4_ = auVar220._0_4_;
    auVar220._28_4_ = auVar220._0_4_;
    local_900._4_4_ = fVar145;
    local_900._0_4_ = fVar145;
    local_900._8_4_ = fVar145;
    local_900._12_4_ = fVar145;
    local_900._16_4_ = fVar145;
    local_900._20_4_ = fVar145;
    local_900._24_4_ = fVar145;
    local_900._28_4_ = fVar145;
    auVar70 = vfmadd231ps_fma(auVar220,local_900,_DAT_02020f20);
    auVar120 = auVar209._0_32_;
    auVar79 = vsubps_avx(auVar120,ZEXT1632(auVar70));
    fVar221 = auVar70._0_4_;
    auVar118._0_4_ = auVar163._0_4_ * fVar221;
    fVar228 = auVar70._4_4_;
    auVar118._4_4_ = auVar163._4_4_ * fVar228;
    fVar229 = auVar70._8_4_;
    auVar118._8_4_ = auVar163._8_4_ * fVar229;
    fVar230 = auVar70._12_4_;
    auVar118._12_4_ = auVar163._12_4_ * fVar230;
    auVar118._16_4_ = auVar163._16_4_ * 0.0;
    auVar118._20_4_ = auVar163._20_4_ * 0.0;
    auVar118._24_4_ = auVar163._24_4_ * 0.0;
    auVar118._28_4_ = 0;
    auVar95 = ZEXT1632(auVar70);
    auVar244._0_4_ = auVar216._0_4_ * fVar221;
    auVar244._4_4_ = auVar216._4_4_ * fVar228;
    auVar244._8_4_ = auVar216._8_4_ * fVar229;
    auVar244._12_4_ = auVar216._12_4_ * fVar230;
    auVar244._16_4_ = auVar216._16_4_ * 0.0;
    auVar244._20_4_ = auVar216._20_4_ * 0.0;
    auVar244._28_36_ = auVar163._28_36_;
    auVar244._24_4_ = auVar216._24_4_ * 0.0;
    auVar93 = vmulps_avx512vl(auVar86,auVar95);
    auVar94 = vmulps_avx512vl(auVar87,auVar95);
    auVar72 = vfmadd231ps_fma(auVar118,auVar79,auVar234._0_32_);
    auVar73 = vfmadd231ps_fma(auVar244._0_32_,auVar79,auVar83);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar79,auVar84);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar79,auVar85);
    auVar95 = vmulps_avx512vl(auVar88,auVar95);
    auVar101 = ZEXT1632(auVar70);
    auVar96 = vmulps_avx512vl(auVar89,auVar101);
    auVar97 = vmulps_avx512vl(auVar90,auVar101);
    auVar98 = vmulps_avx512vl(auVar91,auVar101);
    auVar74 = vfmadd231ps_fma(auVar95,auVar79,auVar163._0_32_);
    auVar1 = vfmadd231ps_fma(auVar96,auVar79,auVar216._0_32_);
    auVar95 = vfmadd231ps_avx512vl(auVar97,auVar79,auVar86);
    auVar96 = vfmadd231ps_avx512vl(auVar98,auVar79,auVar87);
    auVar97 = vmulps_avx512vl(auVar80,auVar101);
    auVar98 = vmulps_avx512vl(auVar81,auVar101);
    auVar99 = vmulps_avx512vl(auVar92,auVar101);
    auVar100 = vmulps_avx512vl(auVar78,auVar101);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar79,auVar88);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar79,auVar89);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar79,auVar90);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar79,auVar91);
    auVar101 = vmulps_avx512vl(auVar101,ZEXT1632(auVar74));
    auVar107 = ZEXT1632(auVar70);
    auVar102 = vmulps_avx512vl(auVar107,ZEXT1632(auVar1));
    auVar103 = vmulps_avx512vl(auVar107,auVar95);
    auVar104 = vmulps_avx512vl(auVar107,auVar96);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar79,ZEXT1632(auVar72));
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar79,ZEXT1632(auVar73));
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar79,auVar93);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar79,auVar94);
    auVar123._0_4_ = auVar97._0_4_ * fVar221;
    auVar123._4_4_ = auVar97._4_4_ * fVar228;
    auVar123._8_4_ = auVar97._8_4_ * fVar229;
    auVar123._12_4_ = auVar97._12_4_ * fVar230;
    auVar123._16_4_ = auVar97._16_4_ * 0.0;
    auVar123._20_4_ = auVar97._20_4_ * 0.0;
    auVar123._24_4_ = auVar97._24_4_ * 0.0;
    auVar123._28_4_ = 0;
    auVar105._4_4_ = auVar98._4_4_ * fVar228;
    auVar105._0_4_ = auVar98._0_4_ * fVar221;
    auVar105._8_4_ = auVar98._8_4_ * fVar229;
    auVar105._12_4_ = auVar98._12_4_ * fVar230;
    auVar105._16_4_ = auVar98._16_4_ * 0.0;
    auVar105._20_4_ = auVar98._20_4_ * 0.0;
    auVar105._24_4_ = auVar98._24_4_ * 0.0;
    auVar105._28_4_ = auVar97._28_4_;
    auVar106._4_4_ = auVar99._4_4_ * fVar228;
    auVar106._0_4_ = auVar99._0_4_ * fVar221;
    auVar106._8_4_ = auVar99._8_4_ * fVar229;
    auVar106._12_4_ = auVar99._12_4_ * fVar230;
    auVar106._16_4_ = auVar99._16_4_ * 0.0;
    auVar106._20_4_ = auVar99._20_4_ * 0.0;
    auVar106._24_4_ = auVar99._24_4_ * 0.0;
    auVar106._28_4_ = auVar98._28_4_;
    auVar111._4_4_ = auVar100._4_4_ * fVar228;
    auVar111._0_4_ = auVar100._0_4_ * fVar221;
    auVar111._8_4_ = auVar100._8_4_ * fVar229;
    auVar111._12_4_ = auVar100._12_4_ * fVar230;
    auVar111._16_4_ = auVar100._16_4_ * 0.0;
    auVar111._20_4_ = auVar100._20_4_ * 0.0;
    auVar111._24_4_ = auVar100._24_4_ * 0.0;
    auVar111._28_4_ = auVar99._28_4_;
    auVar70 = vfmadd231ps_fma(auVar123,auVar79,ZEXT1632(auVar74));
    auVar72 = vfmadd231ps_fma(auVar105,auVar79,ZEXT1632(auVar1));
    auVar73 = vfmadd231ps_fma(auVar106,auVar79,auVar95);
    auVar74 = vfmadd231ps_fma(auVar111,auVar79,auVar96);
    auVar112._28_4_ = auVar94._28_4_;
    auVar112._0_28_ =
         ZEXT1628(CONCAT412(fVar230 * auVar70._12_4_,
                            CONCAT48(fVar229 * auVar70._8_4_,
                                     CONCAT44(fVar228 * auVar70._4_4_,fVar221 * auVar70._0_4_))));
    auVar113._28_4_ = auVar93._28_4_;
    auVar113._0_28_ =
         ZEXT1628(CONCAT412(auVar72._12_4_ * fVar230,
                            CONCAT48(auVar72._8_4_ * fVar229,
                                     CONCAT44(auVar72._4_4_ * fVar228,auVar72._0_4_ * fVar221))));
    auVar93 = vmulps_avx512vl(auVar107,ZEXT1632(auVar73));
    auVar97 = vfmadd231ps_avx512vl(auVar112,auVar79,auVar101);
    auVar98 = vfmadd231ps_avx512vl(auVar113,auVar79,auVar102);
    local_8a0 = vfmadd231ps_avx512vl(auVar93,auVar79,auVar103);
    auVar94 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar74._12_4_ * fVar230,
                                            CONCAT48(auVar74._8_4_ * fVar229,
                                                     CONCAT44(auVar74._4_4_ * fVar228,
                                                              auVar74._0_4_ * fVar221)))),auVar104,
                         auVar79);
    auVar79 = vsubps_avx512vl(ZEXT1632(auVar70),auVar101);
    auVar93 = vsubps_avx512vl(ZEXT1632(auVar72),auVar102);
    auVar95 = vsubps_avx512vl(ZEXT1632(auVar73),auVar103);
    auVar99 = vsubps_avx512vl(ZEXT1632(auVar74),auVar104);
    auVar121._4_4_ = fVar236 * auVar79._4_4_ * 3.0;
    auVar121._0_4_ = fVar236 * auVar79._0_4_ * 3.0;
    auVar121._8_4_ = fVar236 * auVar79._8_4_ * 3.0;
    auVar121._12_4_ = fVar236 * auVar79._12_4_ * 3.0;
    auVar121._16_4_ = fVar236 * auVar79._16_4_ * 3.0;
    auVar121._20_4_ = fVar236 * auVar79._20_4_ * 3.0;
    auVar121._24_4_ = fVar236 * auVar79._24_4_ * 3.0;
    auVar121._28_4_ = auVar96._28_4_;
    auVar239._0_4_ = fVar236 * auVar93._0_4_ * 3.0;
    auVar239._4_4_ = fVar236 * auVar93._4_4_ * 3.0;
    auVar239._8_4_ = fVar236 * auVar93._8_4_ * 3.0;
    auVar239._12_4_ = fVar236 * auVar93._12_4_ * 3.0;
    auVar239._16_4_ = fVar236 * auVar93._16_4_ * 3.0;
    auVar239._20_4_ = fVar236 * auVar93._20_4_ * 3.0;
    auVar239._24_4_ = fVar236 * auVar93._24_4_ * 3.0;
    auVar239._28_4_ = 0;
    auVar242._0_4_ = auVar95._0_4_ * 3.0 * fVar236;
    auVar242._4_4_ = auVar95._4_4_ * 3.0 * fVar236;
    auVar242._8_4_ = auVar95._8_4_ * 3.0 * fVar236;
    auVar242._12_4_ = auVar95._12_4_ * 3.0 * fVar236;
    auVar242._16_4_ = auVar95._16_4_ * 3.0 * fVar236;
    auVar242._20_4_ = auVar95._20_4_ * 3.0 * fVar236;
    auVar242._24_4_ = auVar95._24_4_ * 3.0 * fVar236;
    auVar242._28_4_ = 0;
    fVar221 = auVar99._0_4_ * 3.0 * fVar236;
    fVar228 = auVar99._4_4_ * 3.0 * fVar236;
    auVar114._4_4_ = fVar228;
    auVar114._0_4_ = fVar221;
    fVar229 = auVar99._8_4_ * 3.0 * fVar236;
    auVar114._8_4_ = fVar229;
    fVar230 = auVar99._12_4_ * 3.0 * fVar236;
    auVar114._12_4_ = fVar230;
    fVar231 = auVar99._16_4_ * 3.0 * fVar236;
    auVar114._16_4_ = fVar231;
    fVar202 = auVar99._20_4_ * 3.0 * fVar236;
    auVar114._20_4_ = fVar202;
    fVar232 = auVar99._24_4_ * 3.0 * fVar236;
    auVar114._24_4_ = fVar232;
    auVar114._28_4_ = fVar236;
    auVar70 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    auVar96 = vpermt2ps_avx512vl(auVar97,_DAT_0205fd20,ZEXT1632(auVar70));
    auVar99 = vpermt2ps_avx512vl(auVar98,_DAT_0205fd20,ZEXT1632(auVar70));
    auVar95 = ZEXT1632(auVar70);
    auVar100 = vpermt2ps_avx512vl(local_8a0,_DAT_0205fd20,auVar95);
    auVar124._0_4_ = auVar94._0_4_ + fVar221;
    auVar124._4_4_ = auVar94._4_4_ + fVar228;
    auVar124._8_4_ = auVar94._8_4_ + fVar229;
    auVar124._12_4_ = auVar94._12_4_ + fVar230;
    auVar124._16_4_ = auVar94._16_4_ + fVar231;
    auVar124._20_4_ = auVar94._20_4_ + fVar202;
    auVar124._24_4_ = auVar94._24_4_ + fVar232;
    auVar124._28_4_ = auVar94._28_4_ + fVar236;
    auVar79 = vmaxps_avx(auVar94,auVar124);
    auVar93 = vminps_avx(auVar94,auVar124);
    auVar101 = vpermt2ps_avx512vl(auVar94,_DAT_0205fd20,auVar95);
    auVar102 = vpermt2ps_avx512vl(auVar121,_DAT_0205fd20,auVar95);
    auVar103 = vpermt2ps_avx512vl(auVar239,_DAT_0205fd20,auVar95);
    auVar118 = ZEXT1632(auVar70);
    auVar105 = vpermt2ps_avx512vl(auVar242,_DAT_0205fd20,auVar118);
    auVar94 = vpermt2ps_avx512vl(auVar114,_DAT_0205fd20,auVar118);
    auVar104 = vsubps_avx512vl(auVar101,auVar94);
    auVar94 = vsubps_avx(auVar96,auVar97);
    auVar95 = vsubps_avx(auVar99,auVar98);
    auVar106 = vsubps_avx512vl(auVar100,local_8a0);
    auVar107 = vmulps_avx512vl(auVar95,auVar242);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar239,auVar106);
    auVar108 = vmulps_avx512vl(auVar106,auVar121);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar242,auVar94);
    auVar109 = vmulps_avx512vl(auVar94,auVar239);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar121,auVar95);
    auVar109 = vmulps_avx512vl(auVar109,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar108);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar107);
    auVar108 = vmulps_avx512vl(auVar106,auVar106);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar95,auVar95);
    auVar109 = vfmadd231ps_avx512vl(auVar108,auVar94,auVar94);
    auVar108 = vrcp14ps_avx512vl(auVar109);
    auVar110 = vfnmadd213ps_avx512vl(auVar108,auVar109,auVar120);
    auVar108 = vfmadd132ps_avx512vl(auVar110,auVar108,auVar108);
    auVar107 = vmulps_avx512vl(auVar107,auVar108);
    auVar110 = vmulps_avx512vl(auVar95,auVar105);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar103,auVar106);
    auVar111 = vmulps_avx512vl(auVar106,auVar102);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar105,auVar94);
    auVar112 = vmulps_avx512vl(auVar94,auVar103);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar102,auVar95);
    auVar112 = vmulps_avx512vl(auVar112,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar108 = vmulps_avx512vl(auVar110,auVar108);
    auVar107 = vmaxps_avx512vl(auVar107,auVar108);
    auVar107 = vsqrtps_avx512vl(auVar107);
    auVar108 = vmaxps_avx512vl(auVar104,auVar101);
    auVar79 = vmaxps_avx512vl(auVar79,auVar108);
    auVar108 = vaddps_avx512vl(auVar107,auVar79);
    auVar79 = vminps_avx512vl(auVar104,auVar101);
    auVar79 = vminps_avx(auVar93,auVar79);
    auVar79 = vsubps_avx512vl(auVar79,auVar107);
    auVar104._8_4_ = 0x3f800002;
    auVar104._0_8_ = 0x3f8000023f800002;
    auVar104._12_4_ = 0x3f800002;
    auVar104._16_4_ = 0x3f800002;
    auVar104._20_4_ = 0x3f800002;
    auVar104._24_4_ = 0x3f800002;
    auVar104._28_4_ = 0x3f800002;
    auVar93 = vmulps_avx512vl(auVar108,auVar104);
    auVar107._8_4_ = 0x3f7ffffc;
    auVar107._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar107._12_4_ = 0x3f7ffffc;
    auVar107._16_4_ = 0x3f7ffffc;
    auVar107._20_4_ = 0x3f7ffffc;
    auVar107._24_4_ = 0x3f7ffffc;
    auVar107._28_4_ = 0x3f7ffffc;
    auVar79 = vmulps_avx512vl(auVar79,auVar107);
    auVar115._4_4_ = auVar93._4_4_ * auVar93._4_4_;
    auVar115._0_4_ = auVar93._0_4_ * auVar93._0_4_;
    auVar115._8_4_ = auVar93._8_4_ * auVar93._8_4_;
    auVar115._12_4_ = auVar93._12_4_ * auVar93._12_4_;
    auVar115._16_4_ = auVar93._16_4_ * auVar93._16_4_;
    auVar115._20_4_ = auVar93._20_4_ * auVar93._20_4_;
    auVar115._24_4_ = auVar93._24_4_ * auVar93._24_4_;
    auVar115._28_4_ = auVar79._28_4_;
    auVar93 = vrsqrt14ps_avx512vl(auVar109);
    auVar108._8_4_ = 0xbf000000;
    auVar108._0_8_ = 0xbf000000bf000000;
    auVar108._12_4_ = 0xbf000000;
    auVar108._16_4_ = 0xbf000000;
    auVar108._20_4_ = 0xbf000000;
    auVar108._24_4_ = 0xbf000000;
    auVar108._28_4_ = 0xbf000000;
    auVar101 = vmulps_avx512vl(auVar109,auVar108);
    auVar116._4_4_ = auVar93._4_4_ * auVar101._4_4_;
    auVar116._0_4_ = auVar93._0_4_ * auVar101._0_4_;
    auVar116._8_4_ = auVar93._8_4_ * auVar101._8_4_;
    auVar116._12_4_ = auVar93._12_4_ * auVar101._12_4_;
    auVar116._16_4_ = auVar93._16_4_ * auVar101._16_4_;
    auVar116._20_4_ = auVar93._20_4_ * auVar101._20_4_;
    auVar116._24_4_ = auVar93._24_4_ * auVar101._24_4_;
    auVar116._28_4_ = auVar101._28_4_;
    auVar101 = vmulps_avx512vl(auVar93,auVar93);
    auVar101 = vmulps_avx512vl(auVar101,auVar116);
    auVar109._8_4_ = 0x3fc00000;
    auVar109._0_8_ = 0x3fc000003fc00000;
    auVar109._12_4_ = 0x3fc00000;
    auVar109._16_4_ = 0x3fc00000;
    auVar109._20_4_ = 0x3fc00000;
    auVar109._24_4_ = 0x3fc00000;
    auVar109._28_4_ = 0x3fc00000;
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar93,auVar109);
    auVar117._4_4_ = auVar101._4_4_ * auVar94._4_4_;
    auVar117._0_4_ = auVar101._0_4_ * auVar94._0_4_;
    auVar117._8_4_ = auVar101._8_4_ * auVar94._8_4_;
    auVar117._12_4_ = auVar101._12_4_ * auVar94._12_4_;
    auVar117._16_4_ = auVar101._16_4_ * auVar94._16_4_;
    auVar117._20_4_ = auVar101._20_4_ * auVar94._20_4_;
    auVar117._24_4_ = auVar101._24_4_ * auVar94._24_4_;
    auVar117._28_4_ = auVar93._28_4_;
    auVar93 = vmulps_avx512vl(auVar95,auVar101);
    auVar104 = vmulps_avx512vl(auVar106,auVar101);
    auVar107 = vsubps_avx512vl(auVar118,auVar97);
    auVar108 = vsubps_avx512vl(auVar118,auVar98);
    auVar109 = vsubps_avx512vl(auVar118,local_8a0);
    auVar110 = vmulps_avx512vl(local_720,auVar109);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar82,auVar108);
    auVar110 = vfmadd231ps_avx512vl(auVar110,local_700,auVar107);
    auVar111 = vmulps_avx512vl(auVar109,auVar109);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar108,auVar108);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar107,auVar107);
    auVar112 = vmulps_avx512vl(local_720,auVar104);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar93,auVar82);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar117,local_700);
    auVar104 = vmulps_avx512vl(auVar109,auVar104);
    auVar93 = vfmadd231ps_avx512vl(auVar104,auVar108,auVar93);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar107,auVar117);
    local_740 = vmulps_avx512vl(auVar112,auVar112);
    auVar104 = vsubps_avx512vl(local_520,local_740);
    auVar113 = vmulps_avx512vl(auVar112,auVar93);
    auVar110 = vsubps_avx512vl(auVar110,auVar113);
    auVar113 = vaddps_avx512vl(auVar110,auVar110);
    auVar110 = vmulps_avx512vl(auVar93,auVar93);
    auVar111 = vsubps_avx512vl(auVar111,auVar110);
    auVar114 = vsubps_avx512vl(auVar111,auVar115);
    auVar115 = vmulps_avx512vl(auVar113,auVar113);
    auVar110._8_4_ = 0x40800000;
    auVar110._0_8_ = 0x4080000040800000;
    auVar110._12_4_ = 0x40800000;
    auVar110._16_4_ = 0x40800000;
    auVar110._20_4_ = 0x40800000;
    auVar110._24_4_ = 0x40800000;
    auVar110._28_4_ = 0x40800000;
    auVar110 = vmulps_avx512vl(auVar104,auVar110);
    auVar116 = vmulps_avx512vl(auVar110,auVar114);
    auVar116 = vsubps_avx512vl(auVar115,auVar116);
    uVar69 = vcmpps_avx512vl(auVar116,auVar118,5);
    bVar54 = (byte)uVar69;
    if (bVar54 == 0) {
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar116 = vsqrtps_avx512vl(auVar116);
      auVar117 = vaddps_avx512vl(auVar104,auVar104);
      auVar118 = vrcp14ps_avx512vl(auVar117);
      auVar117 = vfnmadd213ps_avx512vl(auVar117,auVar118,auVar120);
      auVar117 = vfmadd132ps_avx512vl(auVar117,auVar118,auVar118);
      auVar26._8_4_ = 0x80000000;
      auVar26._0_8_ = 0x8000000080000000;
      auVar26._12_4_ = 0x80000000;
      auVar26._16_4_ = 0x80000000;
      auVar26._20_4_ = 0x80000000;
      auVar26._24_4_ = 0x80000000;
      auVar26._28_4_ = 0x80000000;
      auVar118 = vxorps_avx512vl(auVar113,auVar26);
      auVar118 = vsubps_avx512vl(auVar118,auVar116);
      auVar118 = vmulps_avx512vl(auVar118,auVar117);
      auVar116 = vsubps_avx512vl(auVar116,auVar113);
      auVar116 = vmulps_avx512vl(auVar116,auVar117);
      auVar117 = vfmadd213ps_avx512vl(auVar112,auVar118,auVar93);
      local_620 = vmulps_avx512vl(auVar101,auVar117);
      auVar117 = vfmadd213ps_avx512vl(auVar112,auVar116,auVar93);
      local_640 = vmulps_avx512vl(auVar101,auVar117);
      auVar152._8_4_ = 0x7f800000;
      auVar152._0_8_ = 0x7f8000007f800000;
      auVar152._12_4_ = 0x7f800000;
      auVar152._16_4_ = 0x7f800000;
      auVar152._20_4_ = 0x7f800000;
      auVar152._24_4_ = 0x7f800000;
      auVar152._28_4_ = 0x7f800000;
      auVar117 = vblendmps_avx512vl(auVar152,auVar118);
      auVar120._0_4_ =
           (uint)(bVar54 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar54 & 1) * local_640._0_4_;
      bVar66 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar120._4_4_ = (uint)bVar66 * auVar117._4_4_ | (uint)!bVar66 * local_640._4_4_;
      bVar66 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar120._8_4_ = (uint)bVar66 * auVar117._8_4_ | (uint)!bVar66 * local_640._8_4_;
      bVar66 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar120._12_4_ = (uint)bVar66 * auVar117._12_4_ | (uint)!bVar66 * local_640._12_4_;
      bVar66 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar120._16_4_ = (uint)bVar66 * auVar117._16_4_ | (uint)!bVar66 * local_640._16_4_;
      bVar66 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar120._20_4_ = (uint)bVar66 * auVar117._20_4_ | (uint)!bVar66 * local_640._20_4_;
      bVar66 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar120._24_4_ = (uint)bVar66 * auVar117._24_4_ | (uint)!bVar66 * local_640._24_4_;
      bVar66 = SUB81(uVar69 >> 7,0);
      auVar120._28_4_ = (uint)bVar66 * auVar117._28_4_ | (uint)!bVar66 * local_640._28_4_;
      auVar153._8_4_ = 0xff800000;
      auVar153._0_8_ = 0xff800000ff800000;
      auVar153._12_4_ = 0xff800000;
      auVar153._16_4_ = 0xff800000;
      auVar153._20_4_ = 0xff800000;
      auVar153._24_4_ = 0xff800000;
      auVar153._28_4_ = 0xff800000;
      auVar117 = vblendmps_avx512vl(auVar153,auVar116);
      auVar119._0_4_ =
           (uint)(bVar54 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar116._0_4_;
      bVar66 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar119._4_4_ = (uint)bVar66 * auVar117._4_4_ | (uint)!bVar66 * auVar116._4_4_;
      bVar66 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar119._8_4_ = (uint)bVar66 * auVar117._8_4_ | (uint)!bVar66 * auVar116._8_4_;
      bVar66 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar119._12_4_ = (uint)bVar66 * auVar117._12_4_ | (uint)!bVar66 * auVar116._12_4_;
      bVar66 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar119._16_4_ = (uint)bVar66 * auVar117._16_4_ | (uint)!bVar66 * auVar116._16_4_;
      bVar66 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar119._20_4_ = (uint)bVar66 * auVar117._20_4_ | (uint)!bVar66 * auVar116._20_4_;
      bVar66 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar119._24_4_ = (uint)bVar66 * auVar117._24_4_ | (uint)!bVar66 * auVar116._24_4_;
      bVar66 = SUB81(uVar69 >> 7,0);
      auVar119._28_4_ = (uint)bVar66 * auVar117._28_4_ | (uint)!bVar66 * auVar116._28_4_;
      auVar154._8_4_ = 0x7fffffff;
      auVar154._0_8_ = 0x7fffffff7fffffff;
      auVar154._12_4_ = 0x7fffffff;
      auVar154._16_4_ = 0x7fffffff;
      auVar154._20_4_ = 0x7fffffff;
      auVar154._24_4_ = 0x7fffffff;
      auVar154._28_4_ = 0x7fffffff;
      vandps_avx512vl(local_740,auVar154);
      auVar116 = vmaxps_avx512vl(local_5e0,local_740);
      auVar27._8_4_ = 0x36000000;
      auVar27._0_8_ = 0x3600000036000000;
      auVar27._12_4_ = 0x36000000;
      auVar27._16_4_ = 0x36000000;
      auVar27._20_4_ = 0x36000000;
      auVar27._24_4_ = 0x36000000;
      auVar27._28_4_ = 0x36000000;
      auVar117 = vmulps_avx512vl(auVar116,auVar27);
      auVar116 = vandps_avx(auVar104,auVar154);
      uVar56 = vcmpps_avx512vl(auVar116,auVar117,1);
      uVar69 = uVar69 & uVar56;
      bVar59 = (byte)uVar69;
      if (bVar59 != 0) {
        uVar56 = vcmpps_avx512vl(auVar114,_DAT_02020f00,2);
        auVar182._8_4_ = 0xff800000;
        auVar182._0_8_ = 0xff800000ff800000;
        auVar182._12_4_ = 0xff800000;
        auVar182._16_4_ = 0xff800000;
        auVar182._20_4_ = 0xff800000;
        auVar182._24_4_ = 0xff800000;
        auVar182._28_4_ = 0xff800000;
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar117 = vblendmps_avx512vl(auVar114,auVar182);
        bVar53 = (byte)uVar56;
        uVar57 = (uint)(bVar53 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar116._0_4_;
        bVar66 = (bool)((byte)(uVar56 >> 1) & 1);
        uVar137 = (uint)bVar66 * auVar117._4_4_ | (uint)!bVar66 * auVar116._4_4_;
        bVar66 = (bool)((byte)(uVar56 >> 2) & 1);
        uVar138 = (uint)bVar66 * auVar117._8_4_ | (uint)!bVar66 * auVar116._8_4_;
        bVar66 = (bool)((byte)(uVar56 >> 3) & 1);
        uVar139 = (uint)bVar66 * auVar117._12_4_ | (uint)!bVar66 * auVar116._12_4_;
        bVar66 = (bool)((byte)(uVar56 >> 4) & 1);
        uVar140 = (uint)bVar66 * auVar117._16_4_ | (uint)!bVar66 * auVar116._16_4_;
        bVar66 = (bool)((byte)(uVar56 >> 5) & 1);
        uVar141 = (uint)bVar66 * auVar117._20_4_ | (uint)!bVar66 * auVar116._20_4_;
        bVar66 = (bool)((byte)(uVar56 >> 6) & 1);
        uVar142 = (uint)bVar66 * auVar117._24_4_ | (uint)!bVar66 * auVar116._24_4_;
        bVar66 = SUB81(uVar56 >> 7,0);
        uVar143 = (uint)bVar66 * auVar117._28_4_ | (uint)!bVar66 * auVar116._28_4_;
        auVar120._0_4_ = (bVar59 & 1) * uVar57 | !(bool)(bVar59 & 1) * auVar120._0_4_;
        bVar66 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar120._4_4_ = bVar66 * uVar137 | !bVar66 * auVar120._4_4_;
        bVar66 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar120._8_4_ = bVar66 * uVar138 | !bVar66 * auVar120._8_4_;
        bVar66 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar120._12_4_ = bVar66 * uVar139 | !bVar66 * auVar120._12_4_;
        bVar66 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar120._16_4_ = bVar66 * uVar140 | !bVar66 * auVar120._16_4_;
        bVar66 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar120._20_4_ = bVar66 * uVar141 | !bVar66 * auVar120._20_4_;
        bVar66 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar120._24_4_ = bVar66 * uVar142 | !bVar66 * auVar120._24_4_;
        bVar66 = SUB81(uVar69 >> 7,0);
        auVar120._28_4_ = bVar66 * uVar143 | !bVar66 * auVar120._28_4_;
        auVar114 = vblendmps_avx512vl(auVar182,auVar114);
        bVar66 = (bool)((byte)(uVar56 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar56 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar56 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar56 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar56 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar56 >> 6) & 1);
        bVar12 = SUB81(uVar56 >> 7,0);
        auVar119._0_4_ =
             (uint)(bVar59 & 1) *
             ((uint)(bVar53 & 1) * auVar114._0_4_ | !(bool)(bVar53 & 1) * uVar57) |
             !(bool)(bVar59 & 1) * auVar119._0_4_;
        bVar6 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar119._4_4_ =
             (uint)bVar6 * ((uint)bVar66 * auVar114._4_4_ | !bVar66 * uVar137) |
             !bVar6 * auVar119._4_4_;
        bVar66 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar119._8_4_ =
             (uint)bVar66 * ((uint)bVar7 * auVar114._8_4_ | !bVar7 * uVar138) |
             !bVar66 * auVar119._8_4_;
        bVar66 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar119._12_4_ =
             (uint)bVar66 * ((uint)bVar8 * auVar114._12_4_ | !bVar8 * uVar139) |
             !bVar66 * auVar119._12_4_;
        bVar66 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar119._16_4_ =
             (uint)bVar66 * ((uint)bVar9 * auVar114._16_4_ | !bVar9 * uVar140) |
             !bVar66 * auVar119._16_4_;
        bVar66 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar119._20_4_ =
             (uint)bVar66 * ((uint)bVar10 * auVar114._20_4_ | !bVar10 * uVar141) |
             !bVar66 * auVar119._20_4_;
        bVar66 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar119._24_4_ =
             (uint)bVar66 * ((uint)bVar11 * auVar114._24_4_ | !bVar11 * uVar142) |
             !bVar66 * auVar119._24_4_;
        bVar66 = SUB81(uVar69 >> 7,0);
        auVar119._28_4_ =
             (uint)bVar66 * ((uint)bVar12 * auVar114._28_4_ | !bVar12 * uVar143) |
             !bVar66 * auVar119._28_4_;
        bVar54 = (~bVar59 | bVar53) & bVar54;
      }
    }
    in_ZMM31 = ZEXT3264(auVar119);
    if ((bVar54 & 0x7f) == 0) {
      auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar244 = ZEXT3264(auVar79);
      auVar122._8_4_ = 0x3f800000;
      auVar122._0_8_ = &DAT_3f8000003f800000;
      auVar122._12_4_ = 0x3f800000;
      auVar122._16_4_ = 0x3f800000;
      auVar122._20_4_ = 0x3f800000;
      auVar122._24_4_ = 0x3f800000;
      auVar122._28_4_ = 0x3f800000;
LAB_01d81e6e:
      auVar209 = ZEXT3264(auVar122);
      auVar234 = ZEXT3264(local_8c0);
      auVar163 = ZEXT3264(local_800);
      auVar216 = ZEXT3264(local_920);
    }
    else {
      fVar221 = *(float *)(ray + k * 4 + 0x200) - (float)local_860._0_4_;
      auVar155._4_4_ = fVar221;
      auVar155._0_4_ = fVar221;
      auVar155._8_4_ = fVar221;
      auVar155._12_4_ = fVar221;
      auVar155._16_4_ = fVar221;
      auVar155._20_4_ = fVar221;
      auVar155._24_4_ = fVar221;
      auVar155._28_4_ = fVar221;
      auVar114 = vminps_avx512vl(auVar155,auVar119);
      auVar50._4_4_ = fStack_53c;
      auVar50._0_4_ = local_540;
      auVar50._8_4_ = fStack_538;
      auVar50._12_4_ = fStack_534;
      auVar50._16_4_ = fStack_530;
      auVar50._20_4_ = fStack_52c;
      auVar50._24_4_ = fStack_528;
      auVar50._28_4_ = fStack_524;
      auVar116 = vmaxps_avx512vl(auVar50,auVar120);
      auVar109 = vmulps_avx512vl(auVar109,auVar242);
      auVar108 = vfmadd213ps_avx512vl(auVar108,auVar239,auVar109);
      auVar107 = vfmadd213ps_avx512vl(auVar107,auVar121,auVar108);
      auVar108 = vmulps_avx512vl(local_720,auVar242);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar82,auVar239);
      auVar108 = vfmadd231ps_avx512vl(auVar108,local_700,auVar121);
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar244 = ZEXT3264(auVar120);
      vandps_avx512vl(auVar108,auVar120);
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar16 = vcmpps_avx512vl(auVar120,auVar109,1);
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      in_ZMM31 = ZEXT3264(auVar121);
      auVar107 = vxorps_avx512vl(auVar107,auVar121);
      auVar117 = vrcp14ps_avx512vl(auVar108);
      auVar118 = vxorps_avx512vl(auVar108,auVar121);
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar123 = vfnmadd213ps_avx512vl(auVar117,auVar108,auVar122);
      auVar123 = vfmadd132ps_avx512vl(auVar123,auVar117,auVar117);
      auVar123 = vmulps_avx512vl(auVar123,auVar107);
      uVar18 = vcmpps_avx512vl(auVar108,auVar118,1);
      bVar59 = (byte)uVar16 | (byte)uVar18;
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar107 = vblendmps_avx512vl(auVar123,auVar124);
      auVar125._0_4_ =
           (uint)(bVar59 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar117._0_4_;
      bVar66 = (bool)(bVar59 >> 1 & 1);
      auVar125._4_4_ = (uint)bVar66 * auVar107._4_4_ | (uint)!bVar66 * auVar117._4_4_;
      bVar66 = (bool)(bVar59 >> 2 & 1);
      auVar125._8_4_ = (uint)bVar66 * auVar107._8_4_ | (uint)!bVar66 * auVar117._8_4_;
      bVar66 = (bool)(bVar59 >> 3 & 1);
      auVar125._12_4_ = (uint)bVar66 * auVar107._12_4_ | (uint)!bVar66 * auVar117._12_4_;
      bVar66 = (bool)(bVar59 >> 4 & 1);
      auVar125._16_4_ = (uint)bVar66 * auVar107._16_4_ | (uint)!bVar66 * auVar117._16_4_;
      bVar66 = (bool)(bVar59 >> 5 & 1);
      auVar125._20_4_ = (uint)bVar66 * auVar107._20_4_ | (uint)!bVar66 * auVar117._20_4_;
      bVar66 = (bool)(bVar59 >> 6 & 1);
      auVar125._24_4_ = (uint)bVar66 * auVar107._24_4_ | (uint)!bVar66 * auVar117._24_4_;
      auVar125._28_4_ =
           (uint)(bVar59 >> 7) * auVar107._28_4_ | (uint)!(bool)(bVar59 >> 7) * auVar117._28_4_;
      auVar107 = vmaxps_avx(auVar116,auVar125);
      uVar18 = vcmpps_avx512vl(auVar108,auVar118,6);
      bVar59 = (byte)uVar16 | (byte)uVar18;
      auVar126._0_4_ = (uint)(bVar59 & 1) * 0x7f800000 | (uint)!(bool)(bVar59 & 1) * auVar123._0_4_;
      bVar66 = (bool)(bVar59 >> 1 & 1);
      auVar126._4_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * auVar123._4_4_;
      bVar66 = (bool)(bVar59 >> 2 & 1);
      auVar126._8_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * auVar123._8_4_;
      bVar66 = (bool)(bVar59 >> 3 & 1);
      auVar126._12_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * auVar123._12_4_;
      bVar66 = (bool)(bVar59 >> 4 & 1);
      auVar126._16_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * auVar123._16_4_;
      bVar66 = (bool)(bVar59 >> 5 & 1);
      auVar126._20_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * auVar123._20_4_;
      bVar66 = (bool)(bVar59 >> 6 & 1);
      auVar126._24_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * auVar123._24_4_;
      auVar126._28_4_ =
           (uint)(bVar59 >> 7) * 0x7f800000 | (uint)!(bool)(bVar59 >> 7) * auVar123._28_4_;
      auVar108 = vminps_avx(auVar114,auVar126);
      auVar72 = vxorps_avx512vl(auVar118._0_16_,auVar118._0_16_);
      auVar96 = vsubps_avx512vl(ZEXT1632(auVar72),auVar96);
      auVar99 = vsubps_avx512vl(ZEXT1632(auVar72),auVar99);
      auVar100 = vsubps_avx512vl(ZEXT1632(auVar72),auVar100);
      auVar37._4_4_ = auVar100._4_4_ * auVar105._4_4_;
      auVar37._0_4_ = auVar100._0_4_ * auVar105._0_4_;
      auVar37._8_4_ = auVar100._8_4_ * auVar105._8_4_;
      auVar37._12_4_ = auVar100._12_4_ * auVar105._12_4_;
      auVar37._16_4_ = auVar100._16_4_ * auVar105._16_4_;
      auVar37._20_4_ = auVar100._20_4_ * auVar105._20_4_;
      auVar37._24_4_ = auVar100._24_4_ * auVar105._24_4_;
      auVar37._28_4_ = auVar100._28_4_;
      auVar99 = vfnmsub231ps_avx512vl(auVar37,auVar103,auVar99);
      auVar96 = vfnmadd231ps_avx512vl(auVar99,auVar102,auVar96);
      auVar99 = vmulps_avx512vl(local_720,auVar105);
      auVar99 = vfnmsub231ps_avx512vl(auVar99,auVar82,auVar103);
      auVar99 = vfnmadd231ps_avx512vl(auVar99,local_700,auVar102);
      vandps_avx512vl(auVar99,auVar120);
      uVar16 = vcmpps_avx512vl(auVar99,auVar109,1);
      auVar96 = vxorps_avx512vl(auVar96,auVar121);
      auVar100 = vrcp14ps_avx512vl(auVar99);
      auVar102 = vxorps_avx512vl(auVar99,auVar121);
      auVar109 = vfnmadd213ps_avx512vl(auVar100,auVar99,auVar122);
      auVar70 = vfmadd132ps_fma(auVar109,auVar100,auVar100);
      fVar221 = auVar70._0_4_ * auVar96._0_4_;
      fVar228 = auVar70._4_4_ * auVar96._4_4_;
      auVar38._4_4_ = fVar228;
      auVar38._0_4_ = fVar221;
      fVar229 = auVar70._8_4_ * auVar96._8_4_;
      auVar38._8_4_ = fVar229;
      fVar230 = auVar70._12_4_ * auVar96._12_4_;
      auVar38._12_4_ = fVar230;
      fVar236 = auVar96._16_4_ * 0.0;
      auVar38._16_4_ = fVar236;
      fVar231 = auVar96._20_4_ * 0.0;
      auVar38._20_4_ = fVar231;
      fVar202 = auVar96._24_4_ * 0.0;
      auVar38._24_4_ = fVar202;
      auVar38._28_4_ = auVar96._28_4_;
      uVar18 = vcmpps_avx512vl(auVar99,auVar102,1);
      bVar59 = (byte)uVar16 | (byte)uVar18;
      auVar109 = vblendmps_avx512vl(auVar38,auVar124);
      auVar127._0_4_ =
           (uint)(bVar59 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar100._0_4_;
      bVar66 = (bool)(bVar59 >> 1 & 1);
      auVar127._4_4_ = (uint)bVar66 * auVar109._4_4_ | (uint)!bVar66 * auVar100._4_4_;
      bVar66 = (bool)(bVar59 >> 2 & 1);
      auVar127._8_4_ = (uint)bVar66 * auVar109._8_4_ | (uint)!bVar66 * auVar100._8_4_;
      bVar66 = (bool)(bVar59 >> 3 & 1);
      auVar127._12_4_ = (uint)bVar66 * auVar109._12_4_ | (uint)!bVar66 * auVar100._12_4_;
      bVar66 = (bool)(bVar59 >> 4 & 1);
      auVar127._16_4_ = (uint)bVar66 * auVar109._16_4_ | (uint)!bVar66 * auVar100._16_4_;
      bVar66 = (bool)(bVar59 >> 5 & 1);
      auVar127._20_4_ = (uint)bVar66 * auVar109._20_4_ | (uint)!bVar66 * auVar100._20_4_;
      bVar66 = (bool)(bVar59 >> 6 & 1);
      auVar127._24_4_ = (uint)bVar66 * auVar109._24_4_ | (uint)!bVar66 * auVar100._24_4_;
      auVar127._28_4_ =
           (uint)(bVar59 >> 7) * auVar109._28_4_ | (uint)!(bool)(bVar59 >> 7) * auVar100._28_4_;
      _local_760 = vmaxps_avx(auVar107,auVar127);
      uVar18 = vcmpps_avx512vl(auVar99,auVar102,6);
      bVar59 = (byte)uVar16 | (byte)uVar18;
      auVar128._0_4_ = (uint)(bVar59 & 1) * 0x7f800000 | (uint)!(bool)(bVar59 & 1) * (int)fVar221;
      bVar66 = (bool)(bVar59 >> 1 & 1);
      auVar128._4_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar228;
      bVar66 = (bool)(bVar59 >> 2 & 1);
      auVar128._8_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar229;
      bVar66 = (bool)(bVar59 >> 3 & 1);
      auVar128._12_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar230;
      bVar66 = (bool)(bVar59 >> 4 & 1);
      auVar128._16_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar236;
      bVar66 = (bool)(bVar59 >> 5 & 1);
      auVar128._20_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar231;
      bVar66 = (bool)(bVar59 >> 6 & 1);
      auVar128._24_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar202;
      auVar128._28_4_ =
           (uint)(bVar59 >> 7) * 0x7f800000 | (uint)!(bool)(bVar59 >> 7) * auVar96._28_4_;
      local_5a0 = vminps_avx(auVar108,auVar128);
      uVar16 = vcmpps_avx512vl(_local_760,local_5a0,2);
      bVar54 = bVar54 & 0x7f & (byte)uVar16;
      if (bVar54 == 0) goto LAB_01d81e6e;
      auVar99 = vmaxps_avx512vl(ZEXT1632(auVar72),auVar79);
      auVar79 = vminps_avx512vl(local_620,auVar122);
      auVar45 = ZEXT412(0);
      auVar96 = ZEXT1232(auVar45) << 0x20;
      auVar79 = vmaxps_avx(auVar79,ZEXT1232(auVar45) << 0x20);
      auVar100 = vminps_avx512vl(local_640,auVar122);
      auVar39._4_4_ = (auVar79._4_4_ + 1.0) * 0.125;
      auVar39._0_4_ = (auVar79._0_4_ + 0.0) * 0.125;
      auVar39._8_4_ = (auVar79._8_4_ + 2.0) * 0.125;
      auVar39._12_4_ = (auVar79._12_4_ + 3.0) * 0.125;
      auVar39._16_4_ = (auVar79._16_4_ + 4.0) * 0.125;
      auVar39._20_4_ = (auVar79._20_4_ + 5.0) * 0.125;
      auVar39._24_4_ = (auVar79._24_4_ + 6.0) * 0.125;
      auVar39._28_4_ = auVar79._28_4_ + 7.0;
      auVar70 = vfmadd213ps_fma(auVar39,local_900,auVar220);
      local_620 = ZEXT1632(auVar70);
      auVar79 = vmaxps_avx(auVar100,ZEXT1232(auVar45) << 0x20);
      auVar40._4_4_ = (auVar79._4_4_ + 1.0) * 0.125;
      auVar40._0_4_ = (auVar79._0_4_ + 0.0) * 0.125;
      auVar40._8_4_ = (auVar79._8_4_ + 2.0) * 0.125;
      auVar40._12_4_ = (auVar79._12_4_ + 3.0) * 0.125;
      auVar40._16_4_ = (auVar79._16_4_ + 4.0) * 0.125;
      auVar40._20_4_ = (auVar79._20_4_ + 5.0) * 0.125;
      auVar40._24_4_ = (auVar79._24_4_ + 6.0) * 0.125;
      auVar40._28_4_ = auVar79._28_4_ + 7.0;
      auVar70 = vfmadd213ps_fma(auVar40,local_900,auVar220);
      local_640 = ZEXT1632(auVar70);
      auVar156._0_4_ = auVar99._0_4_ * auVar99._0_4_;
      auVar156._4_4_ = auVar99._4_4_ * auVar99._4_4_;
      auVar156._8_4_ = auVar99._8_4_ * auVar99._8_4_;
      auVar156._12_4_ = auVar99._12_4_ * auVar99._12_4_;
      auVar156._16_4_ = auVar99._16_4_ * auVar99._16_4_;
      auVar156._20_4_ = auVar99._20_4_ * auVar99._20_4_;
      auVar156._24_4_ = auVar99._24_4_ * auVar99._24_4_;
      auVar156._28_4_ = 0;
      auVar79 = vsubps_avx(auVar111,auVar156);
      auVar99 = vmulps_avx512vl(auVar110,auVar79);
      auVar99 = vsubps_avx512vl(auVar115,auVar99);
      uVar16 = vcmpps_avx512vl(auVar99,ZEXT1232(auVar45) << 0x20,5);
      bVar59 = (byte)uVar16;
      if (bVar59 == 0) {
        auVar93 = ZEXT832(0) << 0x20;
        auVar94 = ZEXT832(0) << 0x20;
        auVar99 = ZEXT832(0) << 0x20;
        auVar100 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar235 = ZEXT828(0) << 0x20;
        auVar129._8_4_ = 0x7f800000;
        auVar129._0_8_ = 0x7f8000007f800000;
        auVar129._12_4_ = 0x7f800000;
        auVar129._16_4_ = 0x7f800000;
        auVar129._20_4_ = 0x7f800000;
        auVar129._24_4_ = 0x7f800000;
        auVar129._28_4_ = 0x7f800000;
        auVar130._8_4_ = 0xff800000;
        auVar130._0_8_ = 0xff800000ff800000;
        auVar130._12_4_ = 0xff800000;
        auVar130._16_4_ = 0xff800000;
        auVar130._20_4_ = 0xff800000;
        auVar130._24_4_ = 0xff800000;
        auVar130._28_4_ = 0xff800000;
      }
      else {
        auVar73 = vxorps_avx512vl(auVar103._0_16_,auVar103._0_16_);
        uVar69 = vcmpps_avx512vl(auVar99,ZEXT1632(auVar72),5);
        auVar96 = vsqrtps_avx(auVar99);
        auVar177._0_4_ = auVar104._0_4_ + auVar104._0_4_;
        auVar177._4_4_ = auVar104._4_4_ + auVar104._4_4_;
        auVar177._8_4_ = auVar104._8_4_ + auVar104._8_4_;
        auVar177._12_4_ = auVar104._12_4_ + auVar104._12_4_;
        auVar177._16_4_ = auVar104._16_4_ + auVar104._16_4_;
        auVar177._20_4_ = auVar104._20_4_ + auVar104._20_4_;
        auVar177._24_4_ = auVar104._24_4_ + auVar104._24_4_;
        auVar177._28_4_ = auVar104._28_4_ + auVar104._28_4_;
        auVar99 = vrcp14ps_avx512vl(auVar177);
        auVar100 = vfnmadd213ps_avx512vl(auVar177,auVar99,auVar122);
        auVar70 = vfmadd132ps_fma(auVar100,auVar99,auVar99);
        auVar28._8_4_ = 0x80000000;
        auVar28._0_8_ = 0x8000000080000000;
        auVar28._12_4_ = 0x80000000;
        auVar28._16_4_ = 0x80000000;
        auVar28._20_4_ = 0x80000000;
        auVar28._24_4_ = 0x80000000;
        auVar28._28_4_ = 0x80000000;
        auVar99 = vxorps_avx512vl(auVar113,auVar28);
        auVar99 = vsubps_avx(auVar99,auVar96);
        auVar41._4_4_ = auVar99._4_4_ * auVar70._4_4_;
        auVar41._0_4_ = auVar99._0_4_ * auVar70._0_4_;
        auVar41._8_4_ = auVar99._8_4_ * auVar70._8_4_;
        auVar41._12_4_ = auVar99._12_4_ * auVar70._12_4_;
        auVar41._16_4_ = auVar99._16_4_ * 0.0;
        auVar41._20_4_ = auVar99._20_4_ * 0.0;
        auVar41._24_4_ = auVar99._24_4_ * 0.0;
        auVar41._28_4_ = 0x3e000000;
        auVar96 = vsubps_avx512vl(auVar96,auVar113);
        auVar42._4_4_ = auVar96._4_4_ * auVar70._4_4_;
        auVar42._0_4_ = auVar96._0_4_ * auVar70._0_4_;
        auVar42._8_4_ = auVar96._8_4_ * auVar70._8_4_;
        auVar42._12_4_ = auVar96._12_4_ * auVar70._12_4_;
        auVar42._16_4_ = auVar96._16_4_ * 0.0;
        auVar42._20_4_ = auVar96._20_4_ * 0.0;
        auVar42._24_4_ = auVar96._24_4_ * 0.0;
        auVar42._28_4_ = fVar145;
        auVar96 = vfmadd213ps_avx512vl(auVar112,auVar41,auVar93);
        auVar43._4_4_ = auVar101._4_4_ * auVar96._4_4_;
        auVar43._0_4_ = auVar101._0_4_ * auVar96._0_4_;
        auVar43._8_4_ = auVar101._8_4_ * auVar96._8_4_;
        auVar43._12_4_ = auVar101._12_4_ * auVar96._12_4_;
        auVar43._16_4_ = auVar101._16_4_ * auVar96._16_4_;
        auVar43._20_4_ = auVar101._20_4_ * auVar96._20_4_;
        auVar43._24_4_ = auVar101._24_4_ * auVar96._24_4_;
        auVar43._28_4_ = auVar99._28_4_;
        auVar96 = vmulps_avx512vl(local_700,auVar41);
        auVar100 = vmulps_avx512vl(auVar82,auVar41);
        auVar102 = vmulps_avx512vl(local_720,auVar41);
        auVar99 = vfmadd213ps_avx512vl(auVar94,auVar43,auVar97);
        auVar99 = vsubps_avx512vl(auVar96,auVar99);
        auVar96 = vfmadd213ps_avx512vl(auVar95,auVar43,auVar98);
        auVar100 = vsubps_avx512vl(auVar100,auVar96);
        auVar70 = vfmadd213ps_fma(auVar43,auVar106,local_8a0);
        auVar96 = vsubps_avx(auVar102,ZEXT1632(auVar70));
        auVar235 = auVar96._0_28_;
        auVar93 = vfmadd213ps_avx512vl(auVar112,auVar42,auVar93);
        auVar101 = vmulps_avx512vl(auVar101,auVar93);
        auVar93 = vmulps_avx512vl(local_700,auVar42);
        auVar102 = vmulps_avx512vl(auVar82,auVar42);
        auVar103 = vmulps_avx512vl(local_720,auVar42);
        auVar70 = vfmadd213ps_fma(auVar94,auVar101,auVar97);
        auVar96 = vsubps_avx(auVar93,ZEXT1632(auVar70));
        auVar70 = vfmadd213ps_fma(auVar95,auVar101,auVar98);
        auVar93 = vsubps_avx512vl(auVar102,ZEXT1632(auVar70));
        auVar70 = vfmadd213ps_fma(auVar106,auVar101,local_8a0);
        auVar94 = vsubps_avx512vl(auVar103,ZEXT1632(auVar70));
        auVar198._8_4_ = 0x7f800000;
        auVar198._0_8_ = 0x7f8000007f800000;
        auVar198._12_4_ = 0x7f800000;
        auVar198._16_4_ = 0x7f800000;
        auVar198._20_4_ = 0x7f800000;
        auVar198._24_4_ = 0x7f800000;
        auVar198._28_4_ = 0x7f800000;
        auVar95 = vblendmps_avx512vl(auVar198,auVar41);
        bVar66 = (bool)((byte)uVar69 & 1);
        auVar129._0_4_ = (uint)bVar66 * auVar95._0_4_ | (uint)!bVar66 * auVar97._0_4_;
        bVar66 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar129._4_4_ = (uint)bVar66 * auVar95._4_4_ | (uint)!bVar66 * auVar97._4_4_;
        bVar66 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar129._8_4_ = (uint)bVar66 * auVar95._8_4_ | (uint)!bVar66 * auVar97._8_4_;
        bVar66 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar129._12_4_ = (uint)bVar66 * auVar95._12_4_ | (uint)!bVar66 * auVar97._12_4_;
        bVar66 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar129._16_4_ = (uint)bVar66 * auVar95._16_4_ | (uint)!bVar66 * auVar97._16_4_;
        bVar66 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar129._20_4_ = (uint)bVar66 * auVar95._20_4_ | (uint)!bVar66 * auVar97._20_4_;
        bVar66 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar129._24_4_ = (uint)bVar66 * auVar95._24_4_ | (uint)!bVar66 * auVar97._24_4_;
        bVar66 = SUB81(uVar69 >> 7,0);
        auVar129._28_4_ = (uint)bVar66 * auVar95._28_4_ | (uint)!bVar66 * auVar97._28_4_;
        auVar199._8_4_ = 0xff800000;
        auVar199._0_8_ = 0xff800000ff800000;
        auVar199._12_4_ = 0xff800000;
        auVar199._16_4_ = 0xff800000;
        auVar199._20_4_ = 0xff800000;
        auVar199._24_4_ = 0xff800000;
        auVar199._28_4_ = 0xff800000;
        auVar95 = vblendmps_avx512vl(auVar199,auVar42);
        bVar66 = (bool)((byte)uVar69 & 1);
        auVar130._0_4_ = (uint)bVar66 * auVar95._0_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar130._4_4_ = (uint)bVar66 * auVar95._4_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar130._8_4_ = (uint)bVar66 * auVar95._8_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar130._12_4_ = (uint)bVar66 * auVar95._12_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar130._16_4_ = (uint)bVar66 * auVar95._16_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar130._20_4_ = (uint)bVar66 * auVar95._20_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar130._24_4_ = (uint)bVar66 * auVar95._24_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = SUB81(uVar69 >> 7,0);
        auVar130._28_4_ = (uint)bVar66 * auVar95._28_4_ | (uint)!bVar66 * -0x800000;
        vandps_avx512vl(auVar120,local_740);
        auVar95 = vmaxps_avx(local_5e0,auVar130);
        auVar29._8_4_ = 0x36000000;
        auVar29._0_8_ = 0x3600000036000000;
        auVar29._12_4_ = 0x36000000;
        auVar29._16_4_ = 0x36000000;
        auVar29._20_4_ = 0x36000000;
        auVar29._24_4_ = 0x36000000;
        auVar29._28_4_ = 0x36000000;
        auVar95 = vmulps_avx512vl(auVar95,auVar29);
        vandps_avx512vl(auVar104,auVar120);
        uVar56 = vcmpps_avx512vl(auVar95,auVar95,1);
        uVar69 = uVar69 & uVar56;
        bVar53 = (byte)uVar69;
        if (bVar53 != 0) {
          uVar56 = vcmpps_avx512vl(auVar79,ZEXT1632(auVar73),2);
          auVar233._8_4_ = 0xff800000;
          auVar233._0_8_ = 0xff800000ff800000;
          auVar233._12_4_ = 0xff800000;
          auVar233._16_4_ = 0xff800000;
          auVar233._20_4_ = 0xff800000;
          auVar233._24_4_ = 0xff800000;
          auVar233._28_4_ = 0xff800000;
          auVar237._8_4_ = 0x7f800000;
          auVar237._0_8_ = 0x7f8000007f800000;
          auVar237._12_4_ = 0x7f800000;
          auVar237._16_4_ = 0x7f800000;
          auVar237._20_4_ = 0x7f800000;
          auVar237._24_4_ = 0x7f800000;
          auVar237._28_4_ = 0x7f800000;
          auVar79 = vblendmps_avx512vl(auVar237,auVar233);
          bVar58 = (byte)uVar56;
          uVar57 = (uint)(bVar58 & 1) * auVar79._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar95._0_4_;
          bVar66 = (bool)((byte)(uVar56 >> 1) & 1);
          uVar137 = (uint)bVar66 * auVar79._4_4_ | (uint)!bVar66 * auVar95._4_4_;
          bVar66 = (bool)((byte)(uVar56 >> 2) & 1);
          uVar138 = (uint)bVar66 * auVar79._8_4_ | (uint)!bVar66 * auVar95._8_4_;
          bVar66 = (bool)((byte)(uVar56 >> 3) & 1);
          uVar139 = (uint)bVar66 * auVar79._12_4_ | (uint)!bVar66 * auVar95._12_4_;
          bVar66 = (bool)((byte)(uVar56 >> 4) & 1);
          uVar140 = (uint)bVar66 * auVar79._16_4_ | (uint)!bVar66 * auVar95._16_4_;
          bVar66 = (bool)((byte)(uVar56 >> 5) & 1);
          uVar141 = (uint)bVar66 * auVar79._20_4_ | (uint)!bVar66 * auVar95._20_4_;
          bVar66 = (bool)((byte)(uVar56 >> 6) & 1);
          uVar142 = (uint)bVar66 * auVar79._24_4_ | (uint)!bVar66 * auVar95._24_4_;
          bVar66 = SUB81(uVar56 >> 7,0);
          uVar143 = (uint)bVar66 * auVar79._28_4_ | (uint)!bVar66 * auVar95._28_4_;
          auVar129._0_4_ = (bVar53 & 1) * uVar57 | !(bool)(bVar53 & 1) * auVar129._0_4_;
          bVar66 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar129._4_4_ = bVar66 * uVar137 | !bVar66 * auVar129._4_4_;
          bVar66 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar129._8_4_ = bVar66 * uVar138 | !bVar66 * auVar129._8_4_;
          bVar66 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar129._12_4_ = bVar66 * uVar139 | !bVar66 * auVar129._12_4_;
          bVar66 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar129._16_4_ = bVar66 * uVar140 | !bVar66 * auVar129._16_4_;
          bVar66 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar129._20_4_ = bVar66 * uVar141 | !bVar66 * auVar129._20_4_;
          bVar66 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar129._24_4_ = bVar66 * uVar142 | !bVar66 * auVar129._24_4_;
          bVar66 = SUB81(uVar69 >> 7,0);
          auVar129._28_4_ = bVar66 * uVar143 | !bVar66 * auVar129._28_4_;
          auVar79 = vblendmps_avx512vl(auVar233,auVar237);
          bVar66 = (bool)((byte)(uVar56 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar56 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar56 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar56 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar56 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar56 >> 6) & 1);
          bVar12 = SUB81(uVar56 >> 7,0);
          auVar130._0_4_ =
               (uint)(bVar53 & 1) *
               ((uint)(bVar58 & 1) * auVar79._0_4_ | !(bool)(bVar58 & 1) * uVar57) |
               !(bool)(bVar53 & 1) * auVar130._0_4_;
          bVar6 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar130._4_4_ =
               (uint)bVar6 * ((uint)bVar66 * auVar79._4_4_ | !bVar66 * uVar137) |
               !bVar6 * auVar130._4_4_;
          bVar66 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar130._8_4_ =
               (uint)bVar66 * ((uint)bVar7 * auVar79._8_4_ | !bVar7 * uVar138) |
               !bVar66 * auVar130._8_4_;
          bVar66 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar130._12_4_ =
               (uint)bVar66 * ((uint)bVar8 * auVar79._12_4_ | !bVar8 * uVar139) |
               !bVar66 * auVar130._12_4_;
          bVar66 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar130._16_4_ =
               (uint)bVar66 * ((uint)bVar9 * auVar79._16_4_ | !bVar9 * uVar140) |
               !bVar66 * auVar130._16_4_;
          bVar66 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar130._20_4_ =
               (uint)bVar66 * ((uint)bVar10 * auVar79._20_4_ | !bVar10 * uVar141) |
               !bVar66 * auVar130._20_4_;
          bVar66 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar130._24_4_ =
               (uint)bVar66 * ((uint)bVar11 * auVar79._24_4_ | !bVar11 * uVar142) |
               !bVar66 * auVar130._24_4_;
          bVar66 = SUB81(uVar69 >> 7,0);
          auVar130._28_4_ =
               (uint)bVar66 * ((uint)bVar12 * auVar79._28_4_ | !bVar12 * uVar143) |
               !bVar66 * auVar130._28_4_;
          bVar59 = (~bVar53 | bVar58) & bVar59;
        }
      }
      auVar79 = vmulps_avx512vl(local_720,auVar94);
      auVar79 = vfmadd231ps_avx512vl(auVar79,auVar82,auVar93);
      auVar70 = vfmadd231ps_fma(auVar79,local_700,auVar96);
      _local_500 = _local_760;
      local_4e0 = vminps_avx(local_5a0,auVar129);
      vandps_avx512vl(ZEXT1632(auVar70),auVar120);
      _local_680 = vmaxps_avx(_local_760,auVar130);
      _local_5c0 = _local_680;
      auVar200._8_4_ = 0x3e99999a;
      auVar200._0_8_ = 0x3e99999a3e99999a;
      auVar200._12_4_ = 0x3e99999a;
      auVar200._16_4_ = 0x3e99999a;
      auVar200._20_4_ = 0x3e99999a;
      auVar200._24_4_ = 0x3e99999a;
      auVar200._28_4_ = 0x3e99999a;
      uVar16 = vcmpps_avx512vl(auVar79,auVar200,1);
      uVar18 = vcmpps_avx512vl(_local_760,local_4e0,2);
      bVar53 = (byte)uVar18 & bVar54;
      uVar17 = vcmpps_avx512vl(_local_680,local_5a0,2);
      if ((bVar54 & ((byte)uVar17 | (byte)uVar18)) == 0) {
        auVar209 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        auVar234 = ZEXT3264(local_8c0);
        auVar163 = ZEXT3264(local_800);
        auVar216 = ZEXT3264(local_920);
      }
      else {
        auVar44._4_4_ = auVar235._4_4_ * local_720._4_4_;
        auVar44._0_4_ = auVar235._0_4_ * local_720._0_4_;
        auVar44._8_4_ = auVar235._8_4_ * local_720._8_4_;
        auVar44._12_4_ = auVar235._12_4_ * local_720._12_4_;
        auVar44._16_4_ = auVar235._16_4_ * local_720._16_4_;
        auVar44._20_4_ = auVar235._20_4_ * local_720._20_4_;
        auVar44._24_4_ = auVar235._24_4_ * local_720._24_4_;
        auVar44._28_4_ = 0x3e99999a;
        auVar79 = vfmadd213ps_avx512vl(auVar100,auVar82,auVar44);
        auVar70 = vfmadd213ps_fma(auVar99,local_700,auVar79);
        vandps_avx512vl(ZEXT1632(auVar70),auVar120);
        uVar18 = vcmpps_avx512vl(auVar79,auVar200,1);
        bVar58 = (byte)uVar18 | ~bVar59;
        auVar157._8_4_ = 2;
        auVar157._0_8_ = 0x200000002;
        auVar157._12_4_ = 2;
        auVar157._16_4_ = 2;
        auVar157._20_4_ = 2;
        auVar157._24_4_ = 2;
        auVar157._28_4_ = 2;
        auVar30._8_4_ = 3;
        auVar30._0_8_ = 0x300000003;
        auVar30._12_4_ = 3;
        auVar30._16_4_ = 3;
        auVar30._20_4_ = 3;
        auVar30._24_4_ = 3;
        auVar30._28_4_ = 3;
        auVar79 = vpblendmd_avx512vl(auVar157,auVar30);
        local_580._0_4_ = (uint)(bVar58 & 1) * auVar79._0_4_ | (uint)!(bool)(bVar58 & 1) * 2;
        bVar66 = (bool)(bVar58 >> 1 & 1);
        local_580._4_4_ = (uint)bVar66 * auVar79._4_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar58 >> 2 & 1);
        local_580._8_4_ = (uint)bVar66 * auVar79._8_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar58 >> 3 & 1);
        local_580._12_4_ = (uint)bVar66 * auVar79._12_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar58 >> 4 & 1);
        local_580._16_4_ = (uint)bVar66 * auVar79._16_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar58 >> 5 & 1);
        local_580._20_4_ = (uint)bVar66 * auVar79._20_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar58 >> 6 & 1);
        local_580._24_4_ = (uint)bVar66 * auVar79._24_4_ | (uint)!bVar66 * 2;
        local_580._28_4_ = (uint)(bVar58 >> 7) * auVar79._28_4_ | (uint)!(bool)(bVar58 >> 7) * 2;
        local_600 = vpbroadcastd_avx512vl();
        uVar18 = vpcmpd_avx512vl(local_600,local_580,5);
        bVar58 = (byte)uVar18 & bVar53;
        if (bVar58 == 0) {
          auVar212._8_4_ = 0x7fffffff;
          auVar212._0_8_ = 0x7fffffff7fffffff;
          auVar212._12_4_ = 0x7fffffff;
        }
        else {
          auVar72 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar70 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar73 = vminps_avx(local_7a0._0_16_,local_7e0._0_16_);
          auVar74 = vminps_avx(auVar72,auVar73);
          auVar72 = vmaxps_avx(local_7a0._0_16_,local_7e0._0_16_);
          auVar73 = vmaxps_avx(auVar70,auVar72);
          auVar183._8_4_ = 0x7fffffff;
          auVar183._0_8_ = 0x7fffffff7fffffff;
          auVar183._12_4_ = 0x7fffffff;
          auVar70 = vandps_avx(auVar74,auVar183);
          auVar72 = vandps_avx(auVar73,auVar183);
          auVar70 = vmaxps_avx(auVar70,auVar72);
          auVar72 = vmovshdup_avx(auVar70);
          auVar72 = vmaxss_avx(auVar72,auVar70);
          auVar70 = vshufpd_avx(auVar70,auVar70,1);
          auVar70 = vmaxss_avx(auVar70,auVar72);
          fVar221 = auVar70._0_4_ * 1.9073486e-06;
          local_870 = vshufps_avx(auVar73,auVar73,0xff);
          local_660 = (float)local_760._0_4_ + (float)local_6e0._0_4_;
          fStack_65c = (float)local_760._4_4_ + (float)local_6e0._4_4_;
          fStack_658 = fStack_758 + fStack_6d8;
          fStack_654 = fStack_754 + fStack_6d4;
          fStack_650 = fStack_750 + fStack_6d0;
          fStack_64c = fStack_74c + fStack_6cc;
          fStack_648 = fStack_748 + fStack_6c8;
          fStack_644 = fStack_744 + fStack_6c4;
          do {
            auVar158._8_4_ = 0x7f800000;
            auVar158._0_8_ = 0x7f8000007f800000;
            auVar158._12_4_ = 0x7f800000;
            auVar158._16_4_ = 0x7f800000;
            auVar158._20_4_ = 0x7f800000;
            auVar158._24_4_ = 0x7f800000;
            auVar158._28_4_ = 0x7f800000;
            auVar79 = vblendmps_avx512vl(auVar158,_local_760);
            auVar131._0_4_ =
                 (uint)(bVar58 & 1) * auVar79._0_4_ | (uint)!(bool)(bVar58 & 1) * 0x7f800000;
            bVar66 = (bool)(bVar58 >> 1 & 1);
            auVar131._4_4_ = (uint)bVar66 * auVar79._4_4_ | (uint)!bVar66 * 0x7f800000;
            bVar66 = (bool)(bVar58 >> 2 & 1);
            auVar131._8_4_ = (uint)bVar66 * auVar79._8_4_ | (uint)!bVar66 * 0x7f800000;
            bVar66 = (bool)(bVar58 >> 3 & 1);
            auVar131._12_4_ = (uint)bVar66 * auVar79._12_4_ | (uint)!bVar66 * 0x7f800000;
            bVar66 = (bool)(bVar58 >> 4 & 1);
            auVar131._16_4_ = (uint)bVar66 * auVar79._16_4_ | (uint)!bVar66 * 0x7f800000;
            bVar66 = (bool)(bVar58 >> 5 & 1);
            auVar131._20_4_ = (uint)bVar66 * auVar79._20_4_ | (uint)!bVar66 * 0x7f800000;
            auVar131._24_4_ =
                 (uint)(bVar58 >> 6) * auVar79._24_4_ | (uint)!(bool)(bVar58 >> 6) * 0x7f800000;
            auVar131._28_4_ = 0x7f800000;
            auVar79 = vshufps_avx(auVar131,auVar131,0xb1);
            auVar79 = vminps_avx(auVar131,auVar79);
            auVar93 = vshufpd_avx(auVar79,auVar79,5);
            auVar79 = vminps_avx(auVar79,auVar93);
            auVar93 = vpermpd_avx2(auVar79,0x4e);
            auVar79 = vminps_avx(auVar79,auVar93);
            uVar18 = vcmpps_avx512vl(auVar131,auVar79,0);
            bVar51 = (byte)uVar18 & bVar58;
            bVar62 = bVar58;
            if (bVar51 != 0) {
              bVar62 = bVar51;
            }
            iVar19 = 0;
            for (uVar57 = (uint)bVar62; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x80000000) {
              iVar19 = iVar19 + 1;
            }
            bVar62 = '\x01' << ((byte)iVar19 & 0x1f);
            uVar57 = *(uint *)(local_620 + (uint)(iVar19 << 2));
            fVar228 = *(float *)(local_500 + (uint)(iVar19 << 2));
            fVar229 = auVar14._0_4_;
            if ((float)local_8e0._0_4_ < 0.0) {
              fVar229 = sqrtf((float)local_8e0._0_4_);
            }
            auVar244 = ZEXT464(uVar57);
            bVar51 = ~bVar62;
            lVar64 = 5;
            do {
              auVar146._4_4_ = fVar228;
              auVar146._0_4_ = fVar228;
              auVar146._8_4_ = fVar228;
              auVar146._12_4_ = fVar228;
              auVar72 = vfmadd132ps_fma(auVar146,ZEXT816(0) << 0x40,local_8d0);
              fVar236 = auVar244._0_4_;
              fVar230 = 1.0 - fVar236;
              auVar184._0_4_ = local_7c0._0_4_ * fVar236;
              auVar184._4_4_ = local_7c0._4_4_ * fVar236;
              auVar184._8_4_ = local_7c0._8_4_ * fVar236;
              auVar184._12_4_ = local_7c0._12_4_ * fVar236;
              local_810 = ZEXT416((uint)fVar230);
              auVar204._4_4_ = fVar230;
              auVar204._0_4_ = fVar230;
              auVar204._8_4_ = fVar230;
              auVar204._12_4_ = fVar230;
              auVar70 = vfmadd231ps_fma(auVar184,auVar204,local_780._0_16_);
              auVar210._0_4_ = local_7a0._0_4_ * fVar236;
              auVar210._4_4_ = local_7a0._4_4_ * fVar236;
              auVar210._8_4_ = local_7a0._8_4_ * fVar236;
              auVar210._12_4_ = local_7a0._12_4_ * fVar236;
              auVar73 = vfmadd231ps_fma(auVar210,auVar204,local_7c0._0_16_);
              auVar218._0_4_ = fVar236 * (float)local_7e0._0_4_;
              auVar218._4_4_ = fVar236 * (float)local_7e0._4_4_;
              auVar218._8_4_ = fVar236 * fStack_7d8;
              auVar218._12_4_ = fVar236 * fStack_7d4;
              auVar74 = vfmadd231ps_fma(auVar218,auVar204,local_7a0._0_16_);
              auVar224._0_4_ = fVar236 * auVar73._0_4_;
              auVar224._4_4_ = fVar236 * auVar73._4_4_;
              auVar224._8_4_ = fVar236 * auVar73._8_4_;
              auVar224._12_4_ = fVar236 * auVar73._12_4_;
              auVar70 = vfmadd231ps_fma(auVar224,auVar204,auVar70);
              auVar185._0_4_ = fVar236 * auVar74._0_4_;
              auVar185._4_4_ = fVar236 * auVar74._4_4_;
              auVar185._8_4_ = fVar236 * auVar74._8_4_;
              auVar185._12_4_ = fVar236 * auVar74._12_4_;
              auVar73 = vfmadd231ps_fma(auVar185,auVar204,auVar73);
              auVar211._0_4_ = fVar236 * auVar73._0_4_;
              auVar211._4_4_ = fVar236 * auVar73._4_4_;
              auVar211._8_4_ = fVar236 * auVar73._8_4_;
              auVar211._12_4_ = fVar236 * auVar73._12_4_;
              auVar74 = vfmadd231ps_fma(auVar211,auVar70,auVar204);
              auVar70 = vsubps_avx(auVar73,auVar70);
              auVar20._8_4_ = 0x40400000;
              auVar20._0_8_ = 0x4040000040400000;
              auVar20._12_4_ = 0x40400000;
              auVar73 = vmulps_avx512vl(auVar70,auVar20);
              local_740._0_16_ = auVar74;
              auVar70 = vsubps_avx(auVar72,auVar74);
              local_900._0_16_ = auVar70;
              auVar70 = vdpps_avx(auVar70,auVar70,0x7f);
              local_8a0._0_16_ = auVar70;
              if (auVar70._0_4_ < 0.0) {
                auVar163._0_4_ = sqrtf(auVar70._0_4_);
                auVar163._4_60_ = extraout_var;
                auVar70 = auVar163._0_16_;
              }
              else {
                auVar70 = vsqrtss_avx(auVar70,auVar70);
              }
              local_820 = vdpps_avx(auVar73,auVar73,0x7f);
              fVar230 = local_820._0_4_;
              auVar186._4_12_ = ZEXT812(0) << 0x20;
              auVar186._0_4_ = fVar230;
              auVar72 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar186);
              fVar145 = auVar72._0_4_;
              local_830 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar186);
              auVar21._8_4_ = 0x80000000;
              auVar21._0_8_ = 0x8000000080000000;
              auVar21._12_4_ = 0x80000000;
              auVar74 = vxorps_avx512vl(local_820,auVar21);
              auVar72 = vfnmadd213ss_fma(local_830,local_820,ZEXT416(0x40000000));
              uVar57 = auVar70._0_4_;
              if (fVar230 < auVar74._0_4_) {
                auVar209._0_4_ = sqrtf(fVar230);
                auVar209._4_60_ = extraout_var_00;
                auVar70 = ZEXT416(uVar57);
                auVar74 = auVar209._0_16_;
              }
              else {
                auVar74 = vsqrtss_avx512f(local_820,local_820);
              }
              fVar230 = fVar145 * 1.5 + fVar230 * -0.5 * fVar145 * fVar145 * fVar145;
              local_840._0_4_ = auVar73._0_4_ * fVar230;
              local_840._4_4_ = auVar73._4_4_ * fVar230;
              local_840._8_4_ = auVar73._8_4_ * fVar230;
              local_840._12_4_ = auVar73._12_4_ * fVar230;
              auVar1 = vdpps_avx(local_900._0_16_,local_840,0x7f);
              auVar75 = vaddss_avx512f(auVar70,ZEXT416(0x3f800000));
              auVar147._0_4_ = auVar1._0_4_ * auVar1._0_4_;
              auVar147._4_4_ = auVar1._4_4_ * auVar1._4_4_;
              auVar147._8_4_ = auVar1._8_4_ * auVar1._8_4_;
              auVar147._12_4_ = auVar1._12_4_ * auVar1._12_4_;
              auVar71 = vsubps_avx(local_8a0._0_16_,auVar147);
              fVar145 = auVar71._0_4_;
              auVar165._4_12_ = ZEXT812(0) << 0x20;
              auVar165._0_4_ = fVar145;
              auVar76 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar165);
              fVar231 = auVar76._0_4_;
              uVar67 = fVar145 == 0.0;
              uVar65 = fVar145 < 0.0;
              if ((bool)uVar65) {
                local_850 = fVar230;
                fStack_84c = fVar230;
                fStack_848 = fVar230;
                fStack_844 = fVar230;
                fVar202 = sqrtf(fVar145);
                auVar74 = ZEXT416(auVar74._0_4_);
                auVar70 = ZEXT416(uVar57);
                auVar75 = ZEXT416(auVar75._0_4_);
                fVar230 = local_850;
                fVar232 = fStack_84c;
                fVar240 = fStack_848;
                fVar241 = fStack_844;
              }
              else {
                auVar71 = vsqrtss_avx(auVar71,auVar71);
                fVar202 = auVar71._0_4_;
                fVar232 = fVar230;
                fVar240 = fVar230;
                fVar241 = fVar230;
              }
              auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar71 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar244._0_16_,local_810);
              fVar164 = auVar71._0_4_ * 6.0;
              fVar15 = fVar236 * 6.0;
              auVar187._0_4_ = fVar15 * (float)local_7e0._0_4_;
              auVar187._4_4_ = fVar15 * (float)local_7e0._4_4_;
              auVar187._8_4_ = fVar15 * fStack_7d8;
              auVar187._12_4_ = fVar15 * fStack_7d4;
              auVar166._4_4_ = fVar164;
              auVar166._0_4_ = fVar164;
              auVar166._8_4_ = fVar164;
              auVar166._12_4_ = fVar164;
              auVar71 = vfmadd132ps_fma(auVar166,auVar187,local_7a0._0_16_);
              auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_810,auVar244._0_16_);
              fVar164 = auVar76._0_4_ * 6.0;
              auVar188._4_4_ = fVar164;
              auVar188._0_4_ = fVar164;
              auVar188._8_4_ = fVar164;
              auVar188._12_4_ = fVar164;
              auVar71 = vfmadd132ps_fma(auVar188,auVar71,local_7c0._0_16_);
              fVar164 = local_810._0_4_ * 6.0;
              auVar167._4_4_ = fVar164;
              auVar167._0_4_ = fVar164;
              auVar167._8_4_ = fVar164;
              auVar167._12_4_ = fVar164;
              auVar71 = vfmadd132ps_fma(auVar167,auVar71,local_780._0_16_);
              auVar189._0_4_ = auVar71._0_4_ * (float)local_820._0_4_;
              auVar189._4_4_ = auVar71._4_4_ * (float)local_820._0_4_;
              auVar189._8_4_ = auVar71._8_4_ * (float)local_820._0_4_;
              auVar189._12_4_ = auVar71._12_4_ * (float)local_820._0_4_;
              auVar71 = vdpps_avx(auVar73,auVar71,0x7f);
              fVar164 = auVar71._0_4_;
              auVar168._0_4_ = auVar73._0_4_ * fVar164;
              auVar168._4_4_ = auVar73._4_4_ * fVar164;
              auVar168._8_4_ = auVar73._8_4_ * fVar164;
              auVar168._12_4_ = auVar73._12_4_ * fVar164;
              auVar76 = vsubps_avx(auVar189,auVar168);
              fVar164 = auVar72._0_4_ * (float)local_830._0_4_;
              auVar71 = vmaxss_avx(ZEXT416((uint)fVar221),
                                   ZEXT416((uint)(fVar228 * fVar229 * 1.9073486e-06)));
              auVar22._8_4_ = 0x80000000;
              auVar22._0_8_ = 0x8000000080000000;
              auVar22._12_4_ = 0x80000000;
              auVar77 = vxorps_avx512vl(auVar73,auVar22);
              auVar190._0_4_ = fVar230 * auVar76._0_4_ * fVar164;
              auVar190._4_4_ = fVar232 * auVar76._4_4_ * fVar164;
              auVar190._8_4_ = fVar240 * auVar76._8_4_ * fVar164;
              auVar190._12_4_ = fVar241 * auVar76._12_4_ * fVar164;
              auVar72 = vdpps_avx(auVar77,local_840,0x7f);
              auVar76 = vdivss_avx512f(ZEXT416((uint)fVar221),auVar74);
              auVar74 = vfmadd213ss_fma(auVar70,ZEXT416((uint)fVar221),auVar71);
              auVar70 = vdpps_avx(local_900._0_16_,auVar190,0x7f);
              vfmadd213ss_avx512f(auVar75,auVar76,auVar74);
              fVar230 = auVar72._0_4_ + auVar70._0_4_;
              auVar70 = vdpps_avx(local_8d0,local_840,0x7f);
              auVar72 = vdpps_avx(local_900._0_16_,auVar77,0x7f);
              fVar145 = fVar231 * fVar145 * -0.5 * fVar231 * fVar231 + fVar231 * 1.5;
              auVar74 = vdpps_avx(local_900._0_16_,local_8d0,0x7f);
              in_ZMM31 = ZEXT1664(auVar1);
              auVar75 = vfnmadd231ss_avx512f(auVar72,auVar1,ZEXT416((uint)fVar230));
              auVar76 = vfnmadd231ss_avx512f(auVar74,auVar1,auVar70);
              auVar72 = vpermilps_avx(local_740._0_16_,0xff);
              fVar202 = fVar202 - auVar72._0_4_;
              auVar72 = vshufps_avx(auVar73,auVar73,0xff);
              auVar74 = vfmsub213ss_fma(auVar75,ZEXT416((uint)fVar145),auVar72);
              fVar145 = auVar76._0_4_ * fVar145;
              auVar75 = vfmsub231ss_fma(ZEXT416((uint)(auVar70._0_4_ * auVar74._0_4_)),
                                        ZEXT416((uint)fVar230),ZEXT416((uint)fVar145));
              fVar231 = auVar75._0_4_;
              auVar225._0_4_ = fVar145 / fVar231;
              auVar225._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar205._0_4_ = auVar74._0_4_ / fVar231;
              auVar205._4_12_ = auVar74._4_12_;
              auVar74 = vmulss_avx512f(auVar1,auVar225);
              auVar75 = vmulss_avx512f(auVar1,auVar205);
              fVar236 = fVar236 - (auVar74._0_4_ - fVar202 * (auVar70._0_4_ / fVar231));
              auVar244 = ZEXT464((uint)fVar236);
              fVar228 = fVar228 - (fVar202 * (fVar230 / fVar231) - auVar75._0_4_);
              auVar212._8_4_ = 0x7fffffff;
              auVar212._0_8_ = 0x7fffffff7fffffff;
              auVar212._12_4_ = 0x7fffffff;
              auVar70 = vandps_avx512vl(auVar1,auVar212);
              auVar70 = vucomiss_avx512f(auVar70);
              bVar66 = true;
              if (!(bool)uVar65 && !(bool)uVar67) {
                auVar70 = vaddss_avx512f(auVar71,auVar70);
                auVar74 = vfmadd231ss_fma(auVar70,local_870,ZEXT416(0x36000000));
                auVar70 = vandps_avx(ZEXT416((uint)fVar202),auVar212);
                if (auVar70._0_4_ < auVar74._0_4_) {
                  fVar228 = fVar228 + (float)local_860._0_4_;
                  if ((((fVar144 <= fVar228) &&
                       (fVar230 = *(float *)(ray + k * 4 + 0x200), fVar228 <= fVar230)) &&
                      (0.0 <= fVar236)) && (fVar236 <= 1.0)) {
                    auVar46._12_4_ = 0;
                    auVar46._0_12_ = ZEXT812(0);
                    auVar70 = vrsqrt14ss_avx512f(auVar46 << 0x20,ZEXT416((uint)local_8a0._0_4_));
                    fVar145 = auVar70._0_4_;
                    pGVar3 = (context->scene->geometries).items[uVar63].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar62 = true;
                      }
                      else {
                        fVar145 = fVar145 * 1.5 +
                                  (float)local_8a0._0_4_ * -0.5 * fVar145 * fVar145 * fVar145;
                        auVar169._0_4_ = local_900._0_4_ * fVar145;
                        auVar169._4_4_ = local_900._4_4_ * fVar145;
                        auVar169._8_4_ = local_900._8_4_ * fVar145;
                        auVar169._12_4_ = local_900._12_4_ * fVar145;
                        auVar74 = vfmadd213ps_fma(auVar72,auVar169,auVar73);
                        auVar70 = vshufps_avx(auVar169,auVar169,0xc9);
                        auVar72 = vshufps_avx(auVar73,auVar73,0xc9);
                        auVar170._0_4_ = auVar169._0_4_ * auVar72._0_4_;
                        auVar170._4_4_ = auVar169._4_4_ * auVar72._4_4_;
                        auVar170._8_4_ = auVar169._8_4_ * auVar72._8_4_;
                        auVar170._12_4_ = auVar169._12_4_ * auVar72._12_4_;
                        auVar73 = vfmsub231ps_fma(auVar170,auVar73,auVar70);
                        auVar70 = vshufps_avx(auVar73,auVar73,0xc9);
                        auVar72 = vshufps_avx(auVar74,auVar74,0xc9);
                        auVar73 = vshufps_avx(auVar73,auVar73,0xd2);
                        auVar148._0_4_ = auVar74._0_4_ * auVar73._0_4_;
                        auVar148._4_4_ = auVar74._4_4_ * auVar73._4_4_;
                        auVar148._8_4_ = auVar74._8_4_ * auVar73._8_4_;
                        auVar148._12_4_ = auVar74._12_4_ * auVar73._12_4_;
                        auVar70 = vfmsub231ps_fma(auVar148,auVar70,auVar72);
                        auVar72 = ZEXT416((uint)fVar236);
                        local_340 = vbroadcastss_avx512f(auVar72);
                        auVar163 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar163 = vpermps_avx512f(auVar163,ZEXT1664(auVar70));
                        auVar209 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar209,ZEXT1664(auVar70));
                        local_380 = vbroadcastss_avx512f(auVar70);
                        local_400[0] = (RTCHitN)auVar163[0];
                        local_400[1] = (RTCHitN)auVar163[1];
                        local_400[2] = (RTCHitN)auVar163[2];
                        local_400[3] = (RTCHitN)auVar163[3];
                        local_400[4] = (RTCHitN)auVar163[4];
                        local_400[5] = (RTCHitN)auVar163[5];
                        local_400[6] = (RTCHitN)auVar163[6];
                        local_400[7] = (RTCHitN)auVar163[7];
                        local_400[8] = (RTCHitN)auVar163[8];
                        local_400[9] = (RTCHitN)auVar163[9];
                        local_400[10] = (RTCHitN)auVar163[10];
                        local_400[0xb] = (RTCHitN)auVar163[0xb];
                        local_400[0xc] = (RTCHitN)auVar163[0xc];
                        local_400[0xd] = (RTCHitN)auVar163[0xd];
                        local_400[0xe] = (RTCHitN)auVar163[0xe];
                        local_400[0xf] = (RTCHitN)auVar163[0xf];
                        local_400[0x10] = (RTCHitN)auVar163[0x10];
                        local_400[0x11] = (RTCHitN)auVar163[0x11];
                        local_400[0x12] = (RTCHitN)auVar163[0x12];
                        local_400[0x13] = (RTCHitN)auVar163[0x13];
                        local_400[0x14] = (RTCHitN)auVar163[0x14];
                        local_400[0x15] = (RTCHitN)auVar163[0x15];
                        local_400[0x16] = (RTCHitN)auVar163[0x16];
                        local_400[0x17] = (RTCHitN)auVar163[0x17];
                        local_400[0x18] = (RTCHitN)auVar163[0x18];
                        local_400[0x19] = (RTCHitN)auVar163[0x19];
                        local_400[0x1a] = (RTCHitN)auVar163[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar163[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar163[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar163[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar163[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar163[0x1f];
                        local_400[0x20] = (RTCHitN)auVar163[0x20];
                        local_400[0x21] = (RTCHitN)auVar163[0x21];
                        local_400[0x22] = (RTCHitN)auVar163[0x22];
                        local_400[0x23] = (RTCHitN)auVar163[0x23];
                        local_400[0x24] = (RTCHitN)auVar163[0x24];
                        local_400[0x25] = (RTCHitN)auVar163[0x25];
                        local_400[0x26] = (RTCHitN)auVar163[0x26];
                        local_400[0x27] = (RTCHitN)auVar163[0x27];
                        local_400[0x28] = (RTCHitN)auVar163[0x28];
                        local_400[0x29] = (RTCHitN)auVar163[0x29];
                        local_400[0x2a] = (RTCHitN)auVar163[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar163[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar163[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar163[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar163[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar163[0x2f];
                        local_400[0x30] = (RTCHitN)auVar163[0x30];
                        local_400[0x31] = (RTCHitN)auVar163[0x31];
                        local_400[0x32] = (RTCHitN)auVar163[0x32];
                        local_400[0x33] = (RTCHitN)auVar163[0x33];
                        local_400[0x34] = (RTCHitN)auVar163[0x34];
                        local_400[0x35] = (RTCHitN)auVar163[0x35];
                        local_400[0x36] = (RTCHitN)auVar163[0x36];
                        local_400[0x37] = (RTCHitN)auVar163[0x37];
                        local_400[0x38] = (RTCHitN)auVar163[0x38];
                        local_400[0x39] = (RTCHitN)auVar163[0x39];
                        local_400[0x3a] = (RTCHitN)auVar163[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar163[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar163[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar163[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar163[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar163[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_440._0_8_;
                        uStack_2b8 = local_440._8_8_;
                        uStack_2b0 = local_440._16_8_;
                        uStack_2a8 = local_440._24_8_;
                        uStack_2a0 = local_440._32_8_;
                        uStack_298 = local_440._40_8_;
                        uStack_290 = local_440._48_8_;
                        uStack_288 = local_440._56_8_;
                        auVar163 = vmovdqa64_avx512f(local_480);
                        local_280 = vmovdqa64_avx512f(auVar163);
                        vpcmpeqd_avx2(auVar163._0_32_,auVar163._0_32_);
                        local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar228;
                        local_6c0 = local_4c0;
                        local_950.valid = (int *)local_6c0;
                        local_950.geometryUserPtr = pGVar3->userPtr;
                        local_950.context = context->user;
                        local_950.hit = local_400;
                        local_950.N = 0x10;
                        local_950.ray = (RTCRayN *)ray;
                        if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar3->occlusionFilterN)(&local_950);
                          auVar244 = ZEXT1664(auVar72);
                          auVar212._8_4_ = 0x7fffffff;
                          auVar212._0_8_ = 0x7fffffff7fffffff;
                          auVar212._12_4_ = 0x7fffffff;
                          auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        }
                        auVar163 = vmovdqa64_avx512f(local_6c0);
                        uVar18 = vptestmd_avx512f(auVar163,auVar163);
                        if ((short)uVar18 == 0) {
                          bVar62 = false;
                        }
                        else {
                          p_Var5 = context->args->filter;
                          if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var5)(&local_950);
                            auVar244 = ZEXT1664(auVar72);
                            auVar212._8_4_ = 0x7fffffff;
                            auVar212._0_8_ = 0x7fffffff7fffffff;
                            auVar212._12_4_ = 0x7fffffff;
                            auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          }
                          auVar163 = vmovdqa64_avx512f(local_6c0);
                          uVar69 = vptestmd_avx512f(auVar163,auVar163);
                          auVar163 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                          bVar66 = (bool)((byte)uVar69 & 1);
                          auVar216._0_4_ =
                               (uint)bVar66 * auVar163._0_4_ |
                               (uint)!bVar66 * *(int *)(local_950.ray + 0x200);
                          bVar66 = (bool)((byte)(uVar69 >> 1) & 1);
                          auVar216._4_4_ =
                               (uint)bVar66 * auVar163._4_4_ |
                               (uint)!bVar66 * *(int *)(local_950.ray + 0x204);
                          bVar66 = (bool)((byte)(uVar69 >> 2) & 1);
                          auVar216._8_4_ =
                               (uint)bVar66 * auVar163._8_4_ |
                               (uint)!bVar66 * *(int *)(local_950.ray + 0x208);
                          bVar66 = (bool)((byte)(uVar69 >> 3) & 1);
                          auVar216._12_4_ =
                               (uint)bVar66 * auVar163._12_4_ |
                               (uint)!bVar66 * *(int *)(local_950.ray + 0x20c);
                          bVar66 = (bool)((byte)(uVar69 >> 4) & 1);
                          auVar216._16_4_ =
                               (uint)bVar66 * auVar163._16_4_ |
                               (uint)!bVar66 * *(int *)(local_950.ray + 0x210);
                          bVar66 = (bool)((byte)(uVar69 >> 5) & 1);
                          auVar216._20_4_ =
                               (uint)bVar66 * auVar163._20_4_ |
                               (uint)!bVar66 * *(int *)(local_950.ray + 0x214);
                          bVar66 = (bool)((byte)(uVar69 >> 6) & 1);
                          auVar216._24_4_ =
                               (uint)bVar66 * auVar163._24_4_ |
                               (uint)!bVar66 * *(int *)(local_950.ray + 0x218);
                          bVar66 = (bool)((byte)(uVar69 >> 7) & 1);
                          auVar216._28_4_ =
                               (uint)bVar66 * auVar163._28_4_ |
                               (uint)!bVar66 * *(int *)(local_950.ray + 0x21c);
                          bVar66 = (bool)((byte)(uVar69 >> 8) & 1);
                          auVar216._32_4_ =
                               (uint)bVar66 * auVar163._32_4_ |
                               (uint)!bVar66 * *(int *)(local_950.ray + 0x220);
                          bVar66 = (bool)((byte)(uVar69 >> 9) & 1);
                          auVar216._36_4_ =
                               (uint)bVar66 * auVar163._36_4_ |
                               (uint)!bVar66 * *(int *)(local_950.ray + 0x224);
                          bVar66 = (bool)((byte)(uVar69 >> 10) & 1);
                          auVar216._40_4_ =
                               (uint)bVar66 * auVar163._40_4_ |
                               (uint)!bVar66 * *(int *)(local_950.ray + 0x228);
                          bVar66 = (bool)((byte)(uVar69 >> 0xb) & 1);
                          auVar216._44_4_ =
                               (uint)bVar66 * auVar163._44_4_ |
                               (uint)!bVar66 * *(int *)(local_950.ray + 0x22c);
                          bVar66 = (bool)((byte)(uVar69 >> 0xc) & 1);
                          auVar216._48_4_ =
                               (uint)bVar66 * auVar163._48_4_ |
                               (uint)!bVar66 * *(int *)(local_950.ray + 0x230);
                          bVar66 = (bool)((byte)(uVar69 >> 0xd) & 1);
                          auVar216._52_4_ =
                               (uint)bVar66 * auVar163._52_4_ |
                               (uint)!bVar66 * *(int *)(local_950.ray + 0x234);
                          bVar66 = (bool)((byte)(uVar69 >> 0xe) & 1);
                          auVar216._56_4_ =
                               (uint)bVar66 * auVar163._56_4_ |
                               (uint)!bVar66 * *(int *)(local_950.ray + 0x238);
                          bVar66 = SUB81(uVar69 >> 0xf,0);
                          auVar216._60_4_ =
                               (uint)bVar66 * auVar163._60_4_ |
                               (uint)!bVar66 * *(int *)(local_950.ray + 0x23c);
                          *(undefined1 (*) [64])(local_950.ray + 0x200) = auVar216;
                          bVar62 = (short)uVar69 != 0;
                        }
                        if ((bool)bVar62 == false) {
                          *(float *)(ray + k * 4 + 0x200) = fVar230;
                        }
                      }
                      bVar66 = false;
                      goto LAB_01d82751;
                    }
                  }
                  bVar66 = false;
                  bVar62 = 0;
                }
              }
LAB_01d82751:
              if (!bVar66) goto LAB_01d82b88;
              lVar64 = lVar64 + -1;
            } while (lVar64 != 0);
            bVar62 = 0;
LAB_01d82b88:
            bVar61 = bVar61 | bVar62 & 1;
            auVar48._4_4_ = fStack_65c;
            auVar48._0_4_ = local_660;
            auVar48._8_4_ = fStack_658;
            auVar48._12_4_ = fStack_654;
            auVar48._16_4_ = fStack_650;
            auVar48._20_4_ = fStack_64c;
            auVar48._24_4_ = fStack_648;
            auVar48._28_4_ = fStack_644;
            uVar203 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar31._4_4_ = uVar203;
            auVar31._0_4_ = uVar203;
            auVar31._8_4_ = uVar203;
            auVar31._12_4_ = uVar203;
            auVar31._16_4_ = uVar203;
            auVar31._20_4_ = uVar203;
            auVar31._24_4_ = uVar203;
            auVar31._28_4_ = uVar203;
            uVar18 = vcmpps_avx512vl(auVar48,auVar31,2);
            bVar58 = bVar51 & bVar58 & (byte)uVar18;
          } while (bVar58 != 0);
        }
        auVar159._0_4_ = (float)local_6e0._0_4_ + (float)local_680._0_4_;
        auVar159._4_4_ = (float)local_6e0._4_4_ + (float)local_680._4_4_;
        auVar159._8_4_ = fStack_6d8 + fStack_678;
        auVar159._12_4_ = fStack_6d4 + fStack_674;
        auVar159._16_4_ = fStack_6d0 + fStack_670;
        auVar159._20_4_ = fStack_6cc + fStack_66c;
        auVar159._24_4_ = fStack_6c8 + fStack_668;
        auVar159._28_4_ = fStack_6c4 + fStack_664;
        uVar203 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar32._4_4_ = uVar203;
        auVar32._0_4_ = uVar203;
        auVar32._8_4_ = uVar203;
        auVar32._12_4_ = uVar203;
        auVar32._16_4_ = uVar203;
        auVar32._20_4_ = uVar203;
        auVar32._24_4_ = uVar203;
        auVar32._28_4_ = uVar203;
        uVar18 = vcmpps_avx512vl(auVar159,auVar32,2);
        bVar59 = (byte)uVar16 | ~bVar59;
        bVar54 = (byte)uVar17 & bVar54 & (byte)uVar18;
        auVar160._8_4_ = 2;
        auVar160._0_8_ = 0x200000002;
        auVar160._12_4_ = 2;
        auVar160._16_4_ = 2;
        auVar160._20_4_ = 2;
        auVar160._24_4_ = 2;
        auVar160._28_4_ = 2;
        auVar33._8_4_ = 3;
        auVar33._0_8_ = 0x300000003;
        auVar33._12_4_ = 3;
        auVar33._16_4_ = 3;
        auVar33._20_4_ = 3;
        auVar33._24_4_ = 3;
        auVar33._28_4_ = 3;
        auVar79 = vpblendmd_avx512vl(auVar160,auVar33);
        local_680._0_4_ = (uint)(bVar59 & 1) * auVar79._0_4_ | (uint)!(bool)(bVar59 & 1) * 2;
        bVar66 = (bool)(bVar59 >> 1 & 1);
        local_680._4_4_ = (uint)bVar66 * auVar79._4_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar59 >> 2 & 1);
        fStack_678 = (float)((uint)bVar66 * auVar79._8_4_ | (uint)!bVar66 * 2);
        bVar66 = (bool)(bVar59 >> 3 & 1);
        fStack_674 = (float)((uint)bVar66 * auVar79._12_4_ | (uint)!bVar66 * 2);
        bVar66 = (bool)(bVar59 >> 4 & 1);
        fStack_670 = (float)((uint)bVar66 * auVar79._16_4_ | (uint)!bVar66 * 2);
        bVar66 = (bool)(bVar59 >> 5 & 1);
        fStack_66c = (float)((uint)bVar66 * auVar79._20_4_ | (uint)!bVar66 * 2);
        bVar66 = (bool)(bVar59 >> 6 & 1);
        fStack_668 = (float)((uint)bVar66 * auVar79._24_4_ | (uint)!bVar66 * 2);
        fStack_664 = (float)((uint)(bVar59 >> 7) * auVar79._28_4_ | (uint)!(bool)(bVar59 >> 7) * 2);
        uVar16 = vpcmpd_avx512vl(_local_680,local_600,2);
        bVar59 = (byte)uVar16 & bVar54;
        if (bVar59 == 0) {
          auVar216 = ZEXT3264(local_920);
          auVar244 = ZEXT3264(auVar120);
          auVar234 = ZEXT3264(local_8c0);
        }
        else {
          auVar72 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar70 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar73 = vminps_avx(local_7a0._0_16_,local_7e0._0_16_);
          auVar74 = vminps_avx(auVar72,auVar73);
          auVar72 = vmaxps_avx(local_7a0._0_16_,local_7e0._0_16_);
          auVar73 = vmaxps_avx(auVar70,auVar72);
          auVar70 = vandps_avx(auVar74,auVar212);
          auVar72 = vandps_avx(auVar73,auVar212);
          auVar70 = vmaxps_avx(auVar70,auVar72);
          auVar72 = vmovshdup_avx(auVar70);
          auVar72 = vmaxss_avx(auVar72,auVar70);
          auVar70 = vshufpd_avx(auVar70,auVar70,1);
          auVar70 = vmaxss_avx(auVar70,auVar72);
          fVar221 = auVar70._0_4_ * 1.9073486e-06;
          local_870 = vshufps_avx(auVar73,auVar73,0xff);
          _local_760 = _local_5c0;
          local_660 = (float)local_6e0._0_4_ + (float)local_5c0._0_4_;
          fStack_65c = (float)local_6e0._4_4_ + (float)local_5c0._4_4_;
          fStack_658 = fStack_6d8 + fStack_5b8;
          fStack_654 = fStack_6d4 + fStack_5b4;
          fStack_650 = fStack_6d0 + fStack_5b0;
          fStack_64c = fStack_6cc + fStack_5ac;
          fStack_648 = fStack_6c8 + fStack_5a8;
          fStack_644 = fStack_6c4 + fStack_5a4;
          do {
            auVar161._8_4_ = 0x7f800000;
            auVar161._0_8_ = 0x7f8000007f800000;
            auVar161._12_4_ = 0x7f800000;
            auVar161._16_4_ = 0x7f800000;
            auVar161._20_4_ = 0x7f800000;
            auVar161._24_4_ = 0x7f800000;
            auVar161._28_4_ = 0x7f800000;
            auVar79 = vblendmps_avx512vl(auVar161,_local_760);
            auVar132._0_4_ =
                 (uint)(bVar59 & 1) * auVar79._0_4_ | (uint)!(bool)(bVar59 & 1) * 0x7f800000;
            bVar66 = (bool)(bVar59 >> 1 & 1);
            auVar132._4_4_ = (uint)bVar66 * auVar79._4_4_ | (uint)!bVar66 * 0x7f800000;
            bVar66 = (bool)(bVar59 >> 2 & 1);
            auVar132._8_4_ = (uint)bVar66 * auVar79._8_4_ | (uint)!bVar66 * 0x7f800000;
            bVar66 = (bool)(bVar59 >> 3 & 1);
            auVar132._12_4_ = (uint)bVar66 * auVar79._12_4_ | (uint)!bVar66 * 0x7f800000;
            bVar66 = (bool)(bVar59 >> 4 & 1);
            auVar132._16_4_ = (uint)bVar66 * auVar79._16_4_ | (uint)!bVar66 * 0x7f800000;
            bVar66 = (bool)(bVar59 >> 5 & 1);
            auVar132._20_4_ = (uint)bVar66 * auVar79._20_4_ | (uint)!bVar66 * 0x7f800000;
            auVar132._24_4_ =
                 (uint)(bVar59 >> 6) * auVar79._24_4_ | (uint)!(bool)(bVar59 >> 6) * 0x7f800000;
            auVar132._28_4_ = 0x7f800000;
            auVar79 = vshufps_avx(auVar132,auVar132,0xb1);
            auVar79 = vminps_avx(auVar132,auVar79);
            auVar93 = vshufpd_avx(auVar79,auVar79,5);
            auVar79 = vminps_avx(auVar79,auVar93);
            auVar93 = vpermpd_avx2(auVar79,0x4e);
            auVar79 = vminps_avx(auVar79,auVar93);
            uVar16 = vcmpps_avx512vl(auVar132,auVar79,0);
            bVar62 = (byte)uVar16 & bVar59;
            bVar58 = bVar59;
            if (bVar62 != 0) {
              bVar58 = bVar62;
            }
            iVar19 = 0;
            for (uVar57 = (uint)bVar58; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x80000000) {
              iVar19 = iVar19 + 1;
            }
            bVar58 = '\x01' << ((byte)iVar19 & 0x1f);
            uVar57 = *(uint *)(local_640 + (uint)(iVar19 << 2));
            fVar228 = *(float *)(local_5a0 + (uint)(iVar19 << 2));
            fVar229 = auVar13._0_4_;
            if ((float)local_8e0._0_4_ < 0.0) {
              fVar229 = sqrtf((float)local_8e0._0_4_);
            }
            auVar163 = ZEXT464(uVar57);
            bVar62 = ~bVar58;
            lVar64 = 5;
            do {
              auVar149._4_4_ = fVar228;
              auVar149._0_4_ = fVar228;
              auVar149._8_4_ = fVar228;
              auVar149._12_4_ = fVar228;
              auVar72 = vfmadd132ps_fma(auVar149,ZEXT816(0) << 0x40,local_8d0);
              fVar236 = auVar163._0_4_;
              fVar230 = 1.0 - fVar236;
              auVar191._0_4_ = local_7c0._0_4_ * fVar236;
              auVar191._4_4_ = local_7c0._4_4_ * fVar236;
              auVar191._8_4_ = local_7c0._8_4_ * fVar236;
              auVar191._12_4_ = local_7c0._12_4_ * fVar236;
              local_810 = ZEXT416((uint)fVar230);
              auVar206._4_4_ = fVar230;
              auVar206._0_4_ = fVar230;
              auVar206._8_4_ = fVar230;
              auVar206._12_4_ = fVar230;
              auVar70 = vfmadd231ps_fma(auVar191,auVar206,local_780._0_16_);
              auVar213._0_4_ = local_7a0._0_4_ * fVar236;
              auVar213._4_4_ = local_7a0._4_4_ * fVar236;
              auVar213._8_4_ = local_7a0._8_4_ * fVar236;
              auVar213._12_4_ = local_7a0._12_4_ * fVar236;
              auVar73 = vfmadd231ps_fma(auVar213,auVar206,local_7c0._0_16_);
              auVar219._0_4_ = fVar236 * (float)local_7e0._0_4_;
              auVar219._4_4_ = fVar236 * (float)local_7e0._4_4_;
              auVar219._8_4_ = fVar236 * fStack_7d8;
              auVar219._12_4_ = fVar236 * fStack_7d4;
              auVar74 = vfmadd231ps_fma(auVar219,auVar206,local_7a0._0_16_);
              auVar226._0_4_ = fVar236 * auVar73._0_4_;
              auVar226._4_4_ = fVar236 * auVar73._4_4_;
              auVar226._8_4_ = fVar236 * auVar73._8_4_;
              auVar226._12_4_ = fVar236 * auVar73._12_4_;
              auVar70 = vfmadd231ps_fma(auVar226,auVar206,auVar70);
              auVar192._0_4_ = fVar236 * auVar74._0_4_;
              auVar192._4_4_ = fVar236 * auVar74._4_4_;
              auVar192._8_4_ = fVar236 * auVar74._8_4_;
              auVar192._12_4_ = fVar236 * auVar74._12_4_;
              auVar73 = vfmadd231ps_fma(auVar192,auVar206,auVar73);
              auVar214._0_4_ = fVar236 * auVar73._0_4_;
              auVar214._4_4_ = fVar236 * auVar73._4_4_;
              auVar214._8_4_ = fVar236 * auVar73._8_4_;
              auVar214._12_4_ = fVar236 * auVar73._12_4_;
              auVar74 = vfmadd231ps_fma(auVar214,auVar70,auVar206);
              auVar70 = vsubps_avx(auVar73,auVar70);
              auVar23._8_4_ = 0x40400000;
              auVar23._0_8_ = 0x4040000040400000;
              auVar23._12_4_ = 0x40400000;
              auVar73 = vmulps_avx512vl(auVar70,auVar23);
              local_740._0_16_ = auVar74;
              auVar70 = vsubps_avx(auVar72,auVar74);
              local_900._0_16_ = auVar70;
              auVar70 = vdpps_avx(auVar70,auVar70,0x7f);
              local_8a0._0_16_ = auVar70;
              if (auVar70._0_4_ < 0.0) {
                auVar234._0_4_ = sqrtf(auVar70._0_4_);
                auVar234._4_60_ = extraout_var_01;
                auVar70 = auVar234._0_16_;
              }
              else {
                auVar70 = vsqrtss_avx(auVar70,auVar70);
              }
              local_820 = vdpps_avx(auVar73,auVar73,0x7f);
              fVar230 = local_820._0_4_;
              auVar193._4_12_ = ZEXT812(0) << 0x20;
              auVar193._0_4_ = fVar230;
              auVar72 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar193);
              fVar145 = auVar72._0_4_;
              local_830 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar193);
              auVar24._8_4_ = 0x80000000;
              auVar24._0_8_ = 0x8000000080000000;
              auVar24._12_4_ = 0x80000000;
              auVar74 = vxorps_avx512vl(local_820,auVar24);
              auVar72 = vfnmadd213ss_fma(local_830,local_820,ZEXT416(0x40000000));
              uVar57 = auVar70._0_4_;
              if (fVar230 < auVar74._0_4_) {
                auVar135._0_4_ = sqrtf(fVar230);
                auVar135._4_60_ = extraout_var_02;
                auVar70 = ZEXT416(uVar57);
                auVar74 = auVar135._0_16_;
              }
              else {
                auVar74 = vsqrtss_avx512f(local_820,local_820);
              }
              fVar230 = fVar145 * 1.5 + fVar230 * -0.5 * fVar145 * fVar145 * fVar145;
              local_840._0_4_ = auVar73._0_4_ * fVar230;
              local_840._4_4_ = auVar73._4_4_ * fVar230;
              local_840._8_4_ = auVar73._8_4_ * fVar230;
              local_840._12_4_ = auVar73._12_4_ * fVar230;
              auVar1 = vdpps_avx(local_900._0_16_,local_840,0x7f);
              auVar75 = vaddss_avx512f(auVar70,ZEXT416(0x3f800000));
              auVar150._0_4_ = auVar1._0_4_ * auVar1._0_4_;
              auVar150._4_4_ = auVar1._4_4_ * auVar1._4_4_;
              auVar150._8_4_ = auVar1._8_4_ * auVar1._8_4_;
              auVar150._12_4_ = auVar1._12_4_ * auVar1._12_4_;
              auVar71 = vsubps_avx(local_8a0._0_16_,auVar150);
              fVar145 = auVar71._0_4_;
              auVar171._4_12_ = ZEXT812(0) << 0x20;
              auVar171._0_4_ = fVar145;
              auVar76 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar171);
              fVar231 = auVar76._0_4_;
              uVar67 = fVar145 == 0.0;
              uVar65 = fVar145 < 0.0;
              if ((bool)uVar65) {
                local_850 = fVar230;
                fStack_84c = fVar230;
                fStack_848 = fVar230;
                fStack_844 = fVar230;
                fVar202 = sqrtf(fVar145);
                auVar74 = ZEXT416(auVar74._0_4_);
                auVar70 = ZEXT416(uVar57);
                auVar75 = ZEXT416(auVar75._0_4_);
                fVar230 = local_850;
                fVar232 = fStack_84c;
                fVar240 = fStack_848;
                fVar241 = fStack_844;
              }
              else {
                auVar71 = vsqrtss_avx(auVar71,auVar71);
                fVar202 = auVar71._0_4_;
                fVar232 = fVar230;
                fVar240 = fVar230;
                fVar241 = fVar230;
              }
              auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar244 = ZEXT3264(auVar79);
              auVar234 = ZEXT3264(local_8c0);
              auVar71 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar163._0_16_,local_810);
              fVar164 = auVar71._0_4_ * 6.0;
              fVar15 = fVar236 * 6.0;
              auVar194._0_4_ = fVar15 * (float)local_7e0._0_4_;
              auVar194._4_4_ = fVar15 * (float)local_7e0._4_4_;
              auVar194._8_4_ = fVar15 * fStack_7d8;
              auVar194._12_4_ = fVar15 * fStack_7d4;
              auVar172._4_4_ = fVar164;
              auVar172._0_4_ = fVar164;
              auVar172._8_4_ = fVar164;
              auVar172._12_4_ = fVar164;
              auVar71 = vfmadd132ps_fma(auVar172,auVar194,local_7a0._0_16_);
              auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_810,auVar163._0_16_);
              fVar164 = auVar76._0_4_ * 6.0;
              auVar195._4_4_ = fVar164;
              auVar195._0_4_ = fVar164;
              auVar195._8_4_ = fVar164;
              auVar195._12_4_ = fVar164;
              auVar71 = vfmadd132ps_fma(auVar195,auVar71,local_7c0._0_16_);
              fVar164 = local_810._0_4_ * 6.0;
              auVar173._4_4_ = fVar164;
              auVar173._0_4_ = fVar164;
              auVar173._8_4_ = fVar164;
              auVar173._12_4_ = fVar164;
              auVar71 = vfmadd132ps_fma(auVar173,auVar71,local_780._0_16_);
              auVar196._0_4_ = auVar71._0_4_ * (float)local_820._0_4_;
              auVar196._4_4_ = auVar71._4_4_ * (float)local_820._0_4_;
              auVar196._8_4_ = auVar71._8_4_ * (float)local_820._0_4_;
              auVar196._12_4_ = auVar71._12_4_ * (float)local_820._0_4_;
              auVar71 = vdpps_avx(auVar73,auVar71,0x7f);
              fVar164 = auVar71._0_4_;
              auVar174._0_4_ = auVar73._0_4_ * fVar164;
              auVar174._4_4_ = auVar73._4_4_ * fVar164;
              auVar174._8_4_ = auVar73._8_4_ * fVar164;
              auVar174._12_4_ = auVar73._12_4_ * fVar164;
              auVar76 = vsubps_avx(auVar196,auVar174);
              fVar164 = auVar72._0_4_ * (float)local_830._0_4_;
              auVar71 = vmaxss_avx(ZEXT416((uint)fVar221),
                                   ZEXT416((uint)(fVar228 * fVar229 * 1.9073486e-06)));
              auVar25._8_4_ = 0x80000000;
              auVar25._0_8_ = 0x8000000080000000;
              auVar25._12_4_ = 0x80000000;
              auVar77 = vxorps_avx512vl(auVar73,auVar25);
              auVar197._0_4_ = fVar230 * auVar76._0_4_ * fVar164;
              auVar197._4_4_ = fVar232 * auVar76._4_4_ * fVar164;
              auVar197._8_4_ = fVar240 * auVar76._8_4_ * fVar164;
              auVar197._12_4_ = fVar241 * auVar76._12_4_ * fVar164;
              auVar72 = vdpps_avx(auVar77,local_840,0x7f);
              auVar76 = vdivss_avx512f(ZEXT416((uint)fVar221),auVar74);
              auVar74 = vfmadd213ss_fma(auVar70,ZEXT416((uint)fVar221),auVar71);
              auVar70 = vdpps_avx(local_900._0_16_,auVar197,0x7f);
              vfmadd213ss_avx512f(auVar75,auVar76,auVar74);
              fVar230 = auVar72._0_4_ + auVar70._0_4_;
              auVar70 = vdpps_avx(local_8d0,local_840,0x7f);
              auVar72 = vdpps_avx(local_900._0_16_,auVar77,0x7f);
              fVar145 = fVar231 * fVar145 * -0.5 * fVar231 * fVar231 + fVar231 * 1.5;
              auVar74 = vdpps_avx(local_900._0_16_,local_8d0,0x7f);
              in_ZMM31 = ZEXT1664(auVar1);
              auVar75 = vfnmadd231ss_avx512f(auVar72,auVar1,ZEXT416((uint)fVar230));
              auVar76 = vfnmadd231ss_avx512f(auVar74,auVar1,auVar70);
              auVar72 = vpermilps_avx(local_740._0_16_,0xff);
              fVar202 = fVar202 - auVar72._0_4_;
              auVar72 = vshufps_avx(auVar73,auVar73,0xff);
              auVar74 = vfmsub213ss_fma(auVar75,ZEXT416((uint)fVar145),auVar72);
              fVar145 = auVar76._0_4_ * fVar145;
              auVar75 = vfmsub231ss_fma(ZEXT416((uint)(auVar70._0_4_ * auVar74._0_4_)),
                                        ZEXT416((uint)fVar230),ZEXT416((uint)fVar145));
              fVar231 = auVar75._0_4_;
              auVar227._0_4_ = fVar145 / fVar231;
              auVar227._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar207._0_4_ = auVar74._0_4_ / fVar231;
              auVar207._4_12_ = auVar74._4_12_;
              auVar74 = vmulss_avx512f(auVar1,auVar227);
              auVar75 = vmulss_avx512f(auVar1,auVar207);
              fVar236 = fVar236 - (auVar74._0_4_ - fVar202 * (auVar70._0_4_ / fVar231));
              auVar163 = ZEXT464((uint)fVar236);
              fVar228 = fVar228 - (fVar202 * (fVar230 / fVar231) - auVar75._0_4_);
              auVar215._8_4_ = 0x7fffffff;
              auVar215._0_8_ = 0x7fffffff7fffffff;
              auVar215._12_4_ = 0x7fffffff;
              auVar70 = vandps_avx512vl(auVar1,auVar215);
              auVar70 = vucomiss_avx512f(auVar70);
              bVar66 = true;
              if ((bool)uVar65 || (bool)uVar67) {
LAB_01d83377:
                auVar216 = ZEXT3264(local_920);
              }
              else {
                auVar70 = vaddss_avx512f(auVar71,auVar70);
                auVar74 = vfmadd231ss_fma(auVar70,local_870,ZEXT416(0x36000000));
                auVar70 = vandps_avx(ZEXT416((uint)fVar202),auVar215);
                if (auVar74._0_4_ <= auVar70._0_4_) goto LAB_01d83377;
                fVar228 = fVar228 + (float)local_860._0_4_;
                auVar216 = ZEXT3264(local_920);
                if ((((fVar228 < fVar144) ||
                     (fVar230 = *(float *)(ray + k * 4 + 0x200), fVar230 < fVar228)) ||
                    (fVar236 < 0.0)) || (1.0 < fVar236)) {
LAB_01d83372:
                  bVar66 = false;
                  bVar58 = 0;
                }
                else {
                  auVar47._12_4_ = 0;
                  auVar47._0_12_ = ZEXT812(0);
                  auVar70 = vrsqrt14ss_avx512f(auVar47 << 0x20,ZEXT416((uint)local_8a0._0_4_));
                  fVar145 = auVar70._0_4_;
                  pGVar3 = (context->scene->geometries).items[uVar63].ptr;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) goto LAB_01d83372;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar58 = true;
                  }
                  else {
                    fVar145 = fVar145 * 1.5 +
                              (float)local_8a0._0_4_ * -0.5 * fVar145 * fVar145 * fVar145;
                    auVar175._0_4_ = local_900._0_4_ * fVar145;
                    auVar175._4_4_ = local_900._4_4_ * fVar145;
                    auVar175._8_4_ = local_900._8_4_ * fVar145;
                    auVar175._12_4_ = local_900._12_4_ * fVar145;
                    auVar74 = vfmadd213ps_fma(auVar72,auVar175,auVar73);
                    auVar70 = vshufps_avx(auVar175,auVar175,0xc9);
                    auVar72 = vshufps_avx(auVar73,auVar73,0xc9);
                    auVar176._0_4_ = auVar175._0_4_ * auVar72._0_4_;
                    auVar176._4_4_ = auVar175._4_4_ * auVar72._4_4_;
                    auVar176._8_4_ = auVar175._8_4_ * auVar72._8_4_;
                    auVar176._12_4_ = auVar175._12_4_ * auVar72._12_4_;
                    auVar73 = vfmsub231ps_fma(auVar176,auVar73,auVar70);
                    auVar70 = vshufps_avx(auVar73,auVar73,0xc9);
                    auVar72 = vshufps_avx(auVar74,auVar74,0xc9);
                    auVar73 = vshufps_avx(auVar73,auVar73,0xd2);
                    auVar151._0_4_ = auVar74._0_4_ * auVar73._0_4_;
                    auVar151._4_4_ = auVar74._4_4_ * auVar73._4_4_;
                    auVar151._8_4_ = auVar74._8_4_ * auVar73._8_4_;
                    auVar151._12_4_ = auVar74._12_4_ * auVar73._12_4_;
                    auVar70 = vfmsub231ps_fma(auVar151,auVar70,auVar72);
                    auVar72 = ZEXT416((uint)fVar236);
                    local_340 = vbroadcastss_avx512f(auVar72);
                    auVar209 = vbroadcastss_avx512f(ZEXT416(1));
                    auVar209 = vpermps_avx512f(auVar209,ZEXT1664(auVar70));
                    auVar135 = vbroadcastss_avx512f(ZEXT416(2));
                    local_3c0 = vpermps_avx512f(auVar135,ZEXT1664(auVar70));
                    local_380 = vbroadcastss_avx512f(auVar70);
                    local_400[0] = (RTCHitN)auVar209[0];
                    local_400[1] = (RTCHitN)auVar209[1];
                    local_400[2] = (RTCHitN)auVar209[2];
                    local_400[3] = (RTCHitN)auVar209[3];
                    local_400[4] = (RTCHitN)auVar209[4];
                    local_400[5] = (RTCHitN)auVar209[5];
                    local_400[6] = (RTCHitN)auVar209[6];
                    local_400[7] = (RTCHitN)auVar209[7];
                    local_400[8] = (RTCHitN)auVar209[8];
                    local_400[9] = (RTCHitN)auVar209[9];
                    local_400[10] = (RTCHitN)auVar209[10];
                    local_400[0xb] = (RTCHitN)auVar209[0xb];
                    local_400[0xc] = (RTCHitN)auVar209[0xc];
                    local_400[0xd] = (RTCHitN)auVar209[0xd];
                    local_400[0xe] = (RTCHitN)auVar209[0xe];
                    local_400[0xf] = (RTCHitN)auVar209[0xf];
                    local_400[0x10] = (RTCHitN)auVar209[0x10];
                    local_400[0x11] = (RTCHitN)auVar209[0x11];
                    local_400[0x12] = (RTCHitN)auVar209[0x12];
                    local_400[0x13] = (RTCHitN)auVar209[0x13];
                    local_400[0x14] = (RTCHitN)auVar209[0x14];
                    local_400[0x15] = (RTCHitN)auVar209[0x15];
                    local_400[0x16] = (RTCHitN)auVar209[0x16];
                    local_400[0x17] = (RTCHitN)auVar209[0x17];
                    local_400[0x18] = (RTCHitN)auVar209[0x18];
                    local_400[0x19] = (RTCHitN)auVar209[0x19];
                    local_400[0x1a] = (RTCHitN)auVar209[0x1a];
                    local_400[0x1b] = (RTCHitN)auVar209[0x1b];
                    local_400[0x1c] = (RTCHitN)auVar209[0x1c];
                    local_400[0x1d] = (RTCHitN)auVar209[0x1d];
                    local_400[0x1e] = (RTCHitN)auVar209[0x1e];
                    local_400[0x1f] = (RTCHitN)auVar209[0x1f];
                    local_400[0x20] = (RTCHitN)auVar209[0x20];
                    local_400[0x21] = (RTCHitN)auVar209[0x21];
                    local_400[0x22] = (RTCHitN)auVar209[0x22];
                    local_400[0x23] = (RTCHitN)auVar209[0x23];
                    local_400[0x24] = (RTCHitN)auVar209[0x24];
                    local_400[0x25] = (RTCHitN)auVar209[0x25];
                    local_400[0x26] = (RTCHitN)auVar209[0x26];
                    local_400[0x27] = (RTCHitN)auVar209[0x27];
                    local_400[0x28] = (RTCHitN)auVar209[0x28];
                    local_400[0x29] = (RTCHitN)auVar209[0x29];
                    local_400[0x2a] = (RTCHitN)auVar209[0x2a];
                    local_400[0x2b] = (RTCHitN)auVar209[0x2b];
                    local_400[0x2c] = (RTCHitN)auVar209[0x2c];
                    local_400[0x2d] = (RTCHitN)auVar209[0x2d];
                    local_400[0x2e] = (RTCHitN)auVar209[0x2e];
                    local_400[0x2f] = (RTCHitN)auVar209[0x2f];
                    local_400[0x30] = (RTCHitN)auVar209[0x30];
                    local_400[0x31] = (RTCHitN)auVar209[0x31];
                    local_400[0x32] = (RTCHitN)auVar209[0x32];
                    local_400[0x33] = (RTCHitN)auVar209[0x33];
                    local_400[0x34] = (RTCHitN)auVar209[0x34];
                    local_400[0x35] = (RTCHitN)auVar209[0x35];
                    local_400[0x36] = (RTCHitN)auVar209[0x36];
                    local_400[0x37] = (RTCHitN)auVar209[0x37];
                    local_400[0x38] = (RTCHitN)auVar209[0x38];
                    local_400[0x39] = (RTCHitN)auVar209[0x39];
                    local_400[0x3a] = (RTCHitN)auVar209[0x3a];
                    local_400[0x3b] = (RTCHitN)auVar209[0x3b];
                    local_400[0x3c] = (RTCHitN)auVar209[0x3c];
                    local_400[0x3d] = (RTCHitN)auVar209[0x3d];
                    local_400[0x3e] = (RTCHitN)auVar209[0x3e];
                    local_400[0x3f] = (RTCHitN)auVar209[0x3f];
                    local_300 = 0;
                    uStack_2f8 = 0;
                    uStack_2f0 = 0;
                    uStack_2e8 = 0;
                    uStack_2e0 = 0;
                    uStack_2d8 = 0;
                    uStack_2d0 = 0;
                    uStack_2c8 = 0;
                    local_2c0 = local_440._0_8_;
                    uStack_2b8 = local_440._8_8_;
                    uStack_2b0 = local_440._16_8_;
                    uStack_2a8 = local_440._24_8_;
                    uStack_2a0 = local_440._32_8_;
                    uStack_298 = local_440._40_8_;
                    uStack_290 = local_440._48_8_;
                    uStack_288 = local_440._56_8_;
                    auVar209 = vmovdqa64_avx512f(local_480);
                    local_280 = vmovdqa64_avx512f(auVar209);
                    vpcmpeqd_avx2(auVar209._0_32_,auVar209._0_32_);
                    local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                    local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                    *(float *)(ray + k * 4 + 0x200) = fVar228;
                    local_6c0 = local_4c0;
                    local_950.valid = (int *)local_6c0;
                    local_950.geometryUserPtr = pGVar3->userPtr;
                    local_950.context = context->user;
                    local_950.hit = local_400;
                    local_950.N = 0x10;
                    local_950.ray = (RTCRayN *)ray;
                    if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar3->occlusionFilterN)(&local_950);
                      auVar163 = ZEXT1664(auVar72);
                      auVar216 = ZEXT3264(local_920);
                      auVar234 = ZEXT3264(local_8c0);
                      auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar244 = ZEXT3264(auVar79);
                    }
                    auVar209 = vmovdqa64_avx512f(local_6c0);
                    uVar16 = vptestmd_avx512f(auVar209,auVar209);
                    if ((short)uVar16 == 0) {
                      bVar58 = false;
                    }
                    else {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var5)(&local_950);
                        auVar163 = ZEXT1664(auVar72);
                        auVar216 = ZEXT3264(local_920);
                        auVar234 = ZEXT3264(local_8c0);
                        auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar244 = ZEXT3264(auVar79);
                      }
                      auVar209 = vmovdqa64_avx512f(local_6c0);
                      uVar69 = vptestmd_avx512f(auVar209,auVar209);
                      auVar209 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                      bVar66 = (bool)((byte)uVar69 & 1);
                      auVar136._0_4_ =
                           (uint)bVar66 * auVar209._0_4_ |
                           (uint)!bVar66 * *(int *)(local_950.ray + 0x200);
                      bVar66 = (bool)((byte)(uVar69 >> 1) & 1);
                      auVar136._4_4_ =
                           (uint)bVar66 * auVar209._4_4_ |
                           (uint)!bVar66 * *(int *)(local_950.ray + 0x204);
                      bVar66 = (bool)((byte)(uVar69 >> 2) & 1);
                      auVar136._8_4_ =
                           (uint)bVar66 * auVar209._8_4_ |
                           (uint)!bVar66 * *(int *)(local_950.ray + 0x208);
                      bVar66 = (bool)((byte)(uVar69 >> 3) & 1);
                      auVar136._12_4_ =
                           (uint)bVar66 * auVar209._12_4_ |
                           (uint)!bVar66 * *(int *)(local_950.ray + 0x20c);
                      bVar66 = (bool)((byte)(uVar69 >> 4) & 1);
                      auVar136._16_4_ =
                           (uint)bVar66 * auVar209._16_4_ |
                           (uint)!bVar66 * *(int *)(local_950.ray + 0x210);
                      bVar66 = (bool)((byte)(uVar69 >> 5) & 1);
                      auVar136._20_4_ =
                           (uint)bVar66 * auVar209._20_4_ |
                           (uint)!bVar66 * *(int *)(local_950.ray + 0x214);
                      bVar66 = (bool)((byte)(uVar69 >> 6) & 1);
                      auVar136._24_4_ =
                           (uint)bVar66 * auVar209._24_4_ |
                           (uint)!bVar66 * *(int *)(local_950.ray + 0x218);
                      bVar66 = (bool)((byte)(uVar69 >> 7) & 1);
                      auVar136._28_4_ =
                           (uint)bVar66 * auVar209._28_4_ |
                           (uint)!bVar66 * *(int *)(local_950.ray + 0x21c);
                      bVar66 = (bool)((byte)(uVar69 >> 8) & 1);
                      auVar136._32_4_ =
                           (uint)bVar66 * auVar209._32_4_ |
                           (uint)!bVar66 * *(int *)(local_950.ray + 0x220);
                      bVar66 = (bool)((byte)(uVar69 >> 9) & 1);
                      auVar136._36_4_ =
                           (uint)bVar66 * auVar209._36_4_ |
                           (uint)!bVar66 * *(int *)(local_950.ray + 0x224);
                      bVar66 = (bool)((byte)(uVar69 >> 10) & 1);
                      auVar136._40_4_ =
                           (uint)bVar66 * auVar209._40_4_ |
                           (uint)!bVar66 * *(int *)(local_950.ray + 0x228);
                      bVar66 = (bool)((byte)(uVar69 >> 0xb) & 1);
                      auVar136._44_4_ =
                           (uint)bVar66 * auVar209._44_4_ |
                           (uint)!bVar66 * *(int *)(local_950.ray + 0x22c);
                      bVar66 = (bool)((byte)(uVar69 >> 0xc) & 1);
                      auVar136._48_4_ =
                           (uint)bVar66 * auVar209._48_4_ |
                           (uint)!bVar66 * *(int *)(local_950.ray + 0x230);
                      bVar66 = (bool)((byte)(uVar69 >> 0xd) & 1);
                      auVar136._52_4_ =
                           (uint)bVar66 * auVar209._52_4_ |
                           (uint)!bVar66 * *(int *)(local_950.ray + 0x234);
                      bVar66 = (bool)((byte)(uVar69 >> 0xe) & 1);
                      auVar136._56_4_ =
                           (uint)bVar66 * auVar209._56_4_ |
                           (uint)!bVar66 * *(int *)(local_950.ray + 0x238);
                      bVar66 = SUB81(uVar69 >> 0xf,0);
                      auVar136._60_4_ =
                           (uint)bVar66 * auVar209._60_4_ |
                           (uint)!bVar66 * *(int *)(local_950.ray + 0x23c);
                      *(undefined1 (*) [64])(local_950.ray + 0x200) = auVar136;
                      bVar58 = (short)uVar69 != 0;
                    }
                    if ((bool)bVar58 == false) {
                      *(float *)(ray + k * 4 + 0x200) = fVar230;
                    }
                  }
                  bVar66 = false;
                }
              }
              if (!bVar66) goto LAB_01d837c5;
              lVar64 = lVar64 + -1;
            } while (lVar64 != 0);
            bVar58 = 0;
LAB_01d837c5:
            bVar61 = bVar61 | bVar58 & 1;
            auVar49._4_4_ = fStack_65c;
            auVar49._0_4_ = local_660;
            auVar49._8_4_ = fStack_658;
            auVar49._12_4_ = fStack_654;
            auVar49._16_4_ = fStack_650;
            auVar49._20_4_ = fStack_64c;
            auVar49._24_4_ = fStack_648;
            auVar49._28_4_ = fStack_644;
            uVar203 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar34._4_4_ = uVar203;
            auVar34._0_4_ = uVar203;
            auVar34._8_4_ = uVar203;
            auVar34._12_4_ = uVar203;
            auVar34._16_4_ = uVar203;
            auVar34._20_4_ = uVar203;
            auVar34._24_4_ = uVar203;
            auVar34._28_4_ = uVar203;
            uVar16 = vcmpps_avx512vl(auVar49,auVar34,2);
            bVar59 = bVar62 & bVar59 & (byte)uVar16;
          } while (bVar59 != 0);
        }
        uVar18 = vpcmpd_avx512vl(local_600,_local_680,1);
        uVar17 = vpcmpd_avx512vl(local_600,local_580,1);
        auVar178._0_4_ = (float)local_6e0._0_4_ + (float)local_500._0_4_;
        auVar178._4_4_ = (float)local_6e0._4_4_ + (float)local_500._4_4_;
        auVar178._8_4_ = fStack_6d8 + fStack_4f8;
        auVar178._12_4_ = fStack_6d4 + fStack_4f4;
        auVar178._16_4_ = fStack_6d0 + fStack_4f0;
        auVar178._20_4_ = fStack_6cc + fStack_4ec;
        auVar178._24_4_ = fStack_6c8 + fStack_4e8;
        auVar178._28_4_ = fStack_6c4 + fStack_4e4;
        uVar203 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar201._4_4_ = uVar203;
        auVar201._0_4_ = uVar203;
        auVar201._8_4_ = uVar203;
        auVar201._12_4_ = uVar203;
        auVar201._16_4_ = uVar203;
        auVar201._20_4_ = uVar203;
        auVar201._24_4_ = uVar203;
        auVar201._28_4_ = uVar203;
        uVar16 = vcmpps_avx512vl(auVar178,auVar201,2);
        bVar53 = bVar53 & (byte)uVar17 & (byte)uVar16;
        auVar208._0_4_ = (float)local_6e0._0_4_ + local_5c0._0_4_;
        auVar208._4_4_ = (float)local_6e0._4_4_ + local_5c0._4_4_;
        auVar208._8_4_ = fStack_6d8 + local_5c0._8_4_;
        auVar208._12_4_ = fStack_6d4 + local_5c0._12_4_;
        auVar208._16_4_ = fStack_6d0 + local_5c0._16_4_;
        auVar208._20_4_ = fStack_6cc + local_5c0._20_4_;
        auVar208._24_4_ = fStack_6c8 + local_5c0._24_4_;
        auVar208._28_4_ = fStack_6c4 + local_5c0._28_4_;
        uVar16 = vcmpps_avx512vl(auVar208,auVar201,2);
        bVar54 = bVar54 & (byte)uVar18 & (byte)uVar16 | bVar53;
        if (bVar54 == 0) {
          auVar209 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
          auVar163 = ZEXT3264(local_800);
        }
        else {
          local_1a0[uVar52 * 0x60] = bVar54;
          auVar133._0_4_ =
               (uint)(bVar53 & 1) * local_500._0_4_ |
               (uint)!(bool)(bVar53 & 1) * (int)local_5c0._0_4_;
          bVar66 = (bool)(bVar53 >> 1 & 1);
          auVar133._4_4_ = (uint)bVar66 * local_500._4_4_ | (uint)!bVar66 * (int)local_5c0._4_4_;
          bVar66 = (bool)(bVar53 >> 2 & 1);
          auVar133._8_4_ = (uint)bVar66 * (int)fStack_4f8 | (uint)!bVar66 * (int)local_5c0._8_4_;
          bVar66 = (bool)(bVar53 >> 3 & 1);
          auVar133._12_4_ = (uint)bVar66 * (int)fStack_4f4 | (uint)!bVar66 * (int)local_5c0._12_4_;
          bVar66 = (bool)(bVar53 >> 4 & 1);
          auVar133._16_4_ = (uint)bVar66 * (int)fStack_4f0 | (uint)!bVar66 * (int)local_5c0._16_4_;
          bVar66 = (bool)(bVar53 >> 5 & 1);
          auVar133._20_4_ = (uint)bVar66 * (int)fStack_4ec | (uint)!bVar66 * (int)local_5c0._20_4_;
          auVar133._24_4_ =
               (uint)(bVar53 >> 6) * (int)fStack_4e8 |
               (uint)!(bool)(bVar53 >> 6) * (int)local_5c0._24_4_;
          auVar133._28_4_ = local_5c0._28_4_;
          *(undefined1 (*) [32])(auStack_180 + uVar52 * 0x60) = auVar133;
          uVar16 = vmovlps_avx(local_880);
          *(undefined8 *)(local_160 + uVar52 * 0x18) = uVar16;
          local_158[uVar52 * 0x18] = iVar60 + 1;
          uVar52 = (ulong)((int)uVar52 + 1);
          auVar209 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
          auVar163 = ZEXT3264(local_800);
        }
      }
    }
    do {
      if ((int)uVar52 == 0) {
        if (bVar61 != 0) {
          return bVar68;
        }
        uVar203 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar36._4_4_ = uVar203;
        auVar36._0_4_ = uVar203;
        auVar36._8_4_ = uVar203;
        auVar36._12_4_ = uVar203;
        auVar36._16_4_ = uVar203;
        auVar36._20_4_ = uVar203;
        auVar36._24_4_ = uVar203;
        auVar36._28_4_ = uVar203;
        uVar16 = vcmpps_avx512vl(local_560,auVar36,2);
        uVar63 = (uint)uVar16 & (uint)uVar55 - 1 & (uint)uVar55;
        uVar55 = (ulong)uVar63;
        bVar68 = uVar63 != 0;
        if (!bVar68) {
          return bVar68;
        }
        goto LAB_01d811cc;
      }
      uVar69 = (ulong)((int)uVar52 - 1);
      lVar64 = uVar69 * 0x60;
      auVar79 = *(undefined1 (*) [32])(auStack_180 + lVar64);
      auVar179._0_4_ = auVar79._0_4_ + (float)local_6e0._0_4_;
      auVar179._4_4_ = auVar79._4_4_ + (float)local_6e0._4_4_;
      auVar179._8_4_ = auVar79._8_4_ + fStack_6d8;
      auVar179._12_4_ = auVar79._12_4_ + fStack_6d4;
      auVar179._16_4_ = auVar79._16_4_ + fStack_6d0;
      auVar179._20_4_ = auVar79._20_4_ + fStack_6cc;
      auVar179._24_4_ = auVar79._24_4_ + fStack_6c8;
      auVar179._28_4_ = auVar79._28_4_ + fStack_6c4;
      uVar203 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar35._4_4_ = uVar203;
      auVar35._0_4_ = uVar203;
      auVar35._8_4_ = uVar203;
      auVar35._12_4_ = uVar203;
      auVar35._16_4_ = uVar203;
      auVar35._20_4_ = uVar203;
      auVar35._24_4_ = uVar203;
      auVar35._28_4_ = uVar203;
      uVar16 = vcmpps_avx512vl(auVar179,auVar35,2);
      uVar57 = (uint)uVar16 & (uint)local_1a0[lVar64];
      bVar54 = (byte)uVar57;
      if (uVar57 != 0) {
        auVar180._8_4_ = 0x7f800000;
        auVar180._0_8_ = 0x7f8000007f800000;
        auVar180._12_4_ = 0x7f800000;
        auVar180._16_4_ = 0x7f800000;
        auVar180._20_4_ = 0x7f800000;
        auVar180._24_4_ = 0x7f800000;
        auVar180._28_4_ = 0x7f800000;
        auVar93 = vblendmps_avx512vl(auVar180,auVar79);
        auVar134._0_4_ =
             (uint)(bVar54 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar54 & 1) * (int)auVar79._0_4_;
        bVar66 = (bool)((byte)(uVar57 >> 1) & 1);
        auVar134._4_4_ = (uint)bVar66 * auVar93._4_4_ | (uint)!bVar66 * (int)auVar79._4_4_;
        bVar66 = (bool)((byte)(uVar57 >> 2) & 1);
        auVar134._8_4_ = (uint)bVar66 * auVar93._8_4_ | (uint)!bVar66 * (int)auVar79._8_4_;
        bVar66 = (bool)((byte)(uVar57 >> 3) & 1);
        auVar134._12_4_ = (uint)bVar66 * auVar93._12_4_ | (uint)!bVar66 * (int)auVar79._12_4_;
        bVar66 = (bool)((byte)(uVar57 >> 4) & 1);
        auVar134._16_4_ = (uint)bVar66 * auVar93._16_4_ | (uint)!bVar66 * (int)auVar79._16_4_;
        bVar66 = (bool)((byte)(uVar57 >> 5) & 1);
        auVar134._20_4_ = (uint)bVar66 * auVar93._20_4_ | (uint)!bVar66 * (int)auVar79._20_4_;
        bVar66 = (bool)((byte)(uVar57 >> 6) & 1);
        auVar134._24_4_ = (uint)bVar66 * auVar93._24_4_ | (uint)!bVar66 * (int)auVar79._24_4_;
        auVar134._28_4_ =
             (uVar57 >> 7) * auVar93._28_4_ | (uint)!SUB41(uVar57 >> 7,0) * (int)auVar79._28_4_;
        auVar79 = vshufps_avx(auVar134,auVar134,0xb1);
        auVar79 = vminps_avx(auVar134,auVar79);
        auVar93 = vshufpd_avx(auVar79,auVar79,5);
        auVar79 = vminps_avx(auVar79,auVar93);
        auVar93 = vpermpd_avx2(auVar79,0x4e);
        auVar79 = vminps_avx(auVar79,auVar93);
        uVar16 = vcmpps_avx512vl(auVar134,auVar79,0);
        bVar59 = (byte)uVar16 & bVar54;
        if (bVar59 != 0) {
          uVar57 = (uint)bVar59;
        }
        fVar221 = local_160[uVar69 * 0x18 + 1];
        uVar137 = 0;
        for (; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x80000000) {
          uVar137 = uVar137 + 1;
        }
        iVar60 = local_158[uVar69 * 0x18];
        bVar59 = ~('\x01' << ((byte)uVar137 & 0x1f)) & bVar54;
        local_1a0[lVar64] = bVar59;
        auVar163 = ZEXT3264(local_800);
        uVar56 = uVar69;
        if (bVar59 != 0) {
          uVar56 = uVar52;
        }
        fVar228 = local_160[uVar69 * 0x18];
        auVar181._4_4_ = fVar228;
        auVar181._0_4_ = fVar228;
        auVar181._8_4_ = fVar228;
        auVar181._12_4_ = fVar228;
        auVar181._16_4_ = fVar228;
        auVar181._20_4_ = fVar228;
        auVar181._24_4_ = fVar228;
        auVar181._28_4_ = fVar228;
        fVar221 = fVar221 - fVar228;
        auVar162._4_4_ = fVar221;
        auVar162._0_4_ = fVar221;
        auVar162._8_4_ = fVar221;
        auVar162._12_4_ = fVar221;
        auVar162._16_4_ = fVar221;
        auVar162._20_4_ = fVar221;
        auVar162._24_4_ = fVar221;
        auVar162._28_4_ = fVar221;
        auVar70 = vfmadd132ps_fma(auVar162,auVar181,_DAT_02020f20);
        auVar79 = ZEXT1632(auVar70);
        local_400[0] = (RTCHitN)auVar79[0];
        local_400[1] = (RTCHitN)auVar79[1];
        local_400[2] = (RTCHitN)auVar79[2];
        local_400[3] = (RTCHitN)auVar79[3];
        local_400[4] = (RTCHitN)auVar79[4];
        local_400[5] = (RTCHitN)auVar79[5];
        local_400[6] = (RTCHitN)auVar79[6];
        local_400[7] = (RTCHitN)auVar79[7];
        local_400[8] = (RTCHitN)auVar79[8];
        local_400[9] = (RTCHitN)auVar79[9];
        local_400[10] = (RTCHitN)auVar79[10];
        local_400[0xb] = (RTCHitN)auVar79[0xb];
        local_400[0xc] = (RTCHitN)auVar79[0xc];
        local_400[0xd] = (RTCHitN)auVar79[0xd];
        local_400[0xe] = (RTCHitN)auVar79[0xe];
        local_400[0xf] = (RTCHitN)auVar79[0xf];
        local_400[0x10] = (RTCHitN)auVar79[0x10];
        local_400[0x11] = (RTCHitN)auVar79[0x11];
        local_400[0x12] = (RTCHitN)auVar79[0x12];
        local_400[0x13] = (RTCHitN)auVar79[0x13];
        local_400[0x14] = (RTCHitN)auVar79[0x14];
        local_400[0x15] = (RTCHitN)auVar79[0x15];
        local_400[0x16] = (RTCHitN)auVar79[0x16];
        local_400[0x17] = (RTCHitN)auVar79[0x17];
        local_400[0x18] = (RTCHitN)auVar79[0x18];
        local_400[0x19] = (RTCHitN)auVar79[0x19];
        local_400[0x1a] = (RTCHitN)auVar79[0x1a];
        local_400[0x1b] = (RTCHitN)auVar79[0x1b];
        local_400[0x1c] = (RTCHitN)auVar79[0x1c];
        local_400[0x1d] = (RTCHitN)auVar79[0x1d];
        local_400[0x1e] = (RTCHitN)auVar79[0x1e];
        local_400[0x1f] = (RTCHitN)auVar79[0x1f];
        local_880._8_8_ = 0;
        local_880._0_8_ = *(ulong *)(local_400 + (ulong)uVar137 * 4);
        uVar69 = uVar56;
      }
      uVar52 = uVar69;
    } while (bVar54 == 0);
  } while( true );
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }